

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_cos>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [48];
  undefined1 auVar60 [24];
  undefined1 auVar61 [24];
  undefined8 uVar62;
  undefined8 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined1 auVar77 [32];
  undefined1 auVar76 [16];
  long *in_RDI;
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_cos op;
  Mat *m;
  __m512 y2;
  __m512 z;
  __m512 poly_mask;
  __m512 sign_bit;
  __m512i imm2;
  __m512i imm0;
  __m512 y;
  __m512 xmm3;
  __m512 xmm2;
  __m512 xmm1;
  __m256 y2_1;
  __m256 z_1;
  __m256 poly_mask_1;
  __m256 sign_bit_1;
  __m256i imm2_1;
  __m256i imm0_1;
  __m256 y_1;
  __m256 xmm3_1;
  __m256 xmm2_1;
  __m256 xmm1_1;
  v4sf y2_2;
  v4sf z_2;
  v4sf poly_mask_2;
  v4sf sign_bit_2;
  v4si emm2;
  v4si emm0;
  v4sf y_2;
  v4sf xmm3_2;
  v4sf xmm2_2;
  v4sf xmm1_2;
  undefined8 local_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  int local_297c;
  undefined8 local_2978;
  undefined8 local_2970;
  undefined8 local_2968;
  undefined4 local_2960;
  long local_2958;
  undefined4 local_2950;
  undefined4 local_294c;
  undefined4 local_2948;
  undefined4 local_2944;
  undefined4 local_2940;
  undefined8 local_2938;
  undefined1 (*local_2930) [64];
  int local_2928;
  int local_2924;
  int local_2920;
  int local_291c;
  int local_2918;
  int local_2914;
  int local_2910;
  undefined1 local_2909 [9];
  long *local_2900;
  undefined1 local_28f5;
  int local_28f4;
  undefined8 *local_28e8;
  undefined8 *local_28e0;
  undefined8 *local_28d0;
  undefined1 (*local_28c8) [64];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined1 (*local_2850) [64];
  undefined1 (*local_2848) [64];
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 (*local_2820) [64];
  undefined1 (*local_2818) [64];
  undefined8 local_2810;
  undefined8 uStack_2808;
  undefined1 (*local_2800) [64];
  long local_27f8;
  undefined4 local_27ec;
  long local_27e8;
  undefined1 (*local_27e0) [64];
  undefined4 local_27d4;
  int local_27d0;
  int local_27cc;
  undefined8 *local_27c8;
  undefined4 local_27bc;
  long local_27b8;
  undefined8 *local_27a8;
  undefined8 *local_2780;
  undefined1 *local_2778;
  undefined8 *local_2770;
  undefined1 *local_2768;
  undefined8 *local_2760;
  undefined1 *local_2758;
  undefined1 (*local_2750) [64];
  undefined1 *local_2748;
  undefined1 local_2740 [8];
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  undefined1 local_25c0 [8];
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  float local_2540 [2];
  float afStack_2538 [2];
  float afStack_2530 [2];
  float afStack_2528 [2];
  float afStack_2520 [2];
  float afStack_2518 [2];
  float afStack_2510 [2];
  float afStack_2508 [2];
  float local_2500 [2];
  float afStack_24f8 [2];
  float afStack_24f0 [2];
  float afStack_24e8 [2];
  float afStack_24e0 [2];
  float afStack_24d8 [2];
  float afStack_24d0 [2];
  float afStack_24c8 [2];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  undefined4 local_2344;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  float local_2100 [2];
  float afStack_20f8 [2];
  float afStack_20f0 [2];
  float afStack_20e8 [2];
  float afStack_20e0 [2];
  float afStack_20d8 [2];
  float afStack_20d0 [2];
  float afStack_20c8 [2];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  float local_1f40 [2];
  float afStack_1f38 [2];
  float afStack_1f30 [2];
  float afStack_1f28 [2];
  float afStack_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  float local_1ec0 [2];
  float afStack_1eb8 [2];
  float afStack_1eb0 [2];
  float afStack_1ea8 [2];
  float afStack_1ea0 [2];
  float afStack_1e98 [2];
  float afStack_1e90 [2];
  float afStack_1e88 [2];
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00 [2];
  float afStack_1df8 [2];
  float afStack_1df0 [2];
  float afStack_1de8 [2];
  float afStack_1de0 [2];
  float afStack_1dd8 [2];
  float afStack_1dd0 [2];
  float afStack_1dc8 [2];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  float local_1d80 [2];
  float afStack_1d78 [2];
  float afStack_1d70 [2];
  float afStack_1d68 [2];
  float afStack_1d60 [2];
  float afStack_1d58 [2];
  float afStack_1d50 [2];
  float afStack_1d48 [2];
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float local_1d00 [2];
  float afStack_1cf8 [2];
  float afStack_1cf0 [2];
  float afStack_1ce8 [2];
  float afStack_1ce0 [2];
  float afStack_1cd8 [2];
  float afStack_1cd0 [2];
  float afStack_1cc8 [2];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40 [2];
  float afStack_1c38 [2];
  float afStack_1c30 [2];
  float afStack_1c28 [2];
  float afStack_1c20 [2];
  float afStack_1c18 [2];
  float afStack_1c10 [2];
  float afStack_1c08 [2];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  float local_1b80 [2];
  float afStack_1b78 [2];
  float afStack_1b70 [2];
  float afStack_1b68 [2];
  float afStack_1b60 [2];
  float afStack_1b58 [2];
  float afStack_1b50 [2];
  float afStack_1b48 [2];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  float local_1ac0 [2];
  float afStack_1ab8 [2];
  float afStack_1ab0 [2];
  float afStack_1aa8 [2];
  float afStack_1aa0 [2];
  float afStack_1a98 [2];
  float afStack_1a90 [2];
  float afStack_1a88 [2];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  float local_1940 [2];
  float afStack_1938 [2];
  float afStack_1930 [2];
  float afStack_1928 [2];
  float afStack_1920 [2];
  float afStack_1918 [2];
  float afStack_1910 [2];
  float afStack_1908 [2];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  float local_18c0 [2];
  float afStack_18b8 [2];
  float afStack_18b0 [2];
  float afStack_18a8 [2];
  float afStack_18a0 [2];
  float afStack_1898 [2];
  float afStack_1890 [2];
  float afStack_1888 [2];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  float local_1840 [2];
  float afStack_1838 [2];
  float afStack_1830 [2];
  float afStack_1828 [2];
  float afStack_1820 [2];
  float afStack_1818 [2];
  float afStack_1810 [2];
  float afStack_1808 [2];
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined4 local_16c4;
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined2 local_1502;
  undefined1 local_1500 [64];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_11e0 [8];
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  undefined4 uStack_11b0;
  undefined4 uStack_11ac;
  undefined4 uStack_11a8;
  undefined4 uStack_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined4 local_1000;
  undefined4 uStack_ffc;
  undefined4 uStack_ff8;
  undefined4 uStack_ff4;
  undefined4 uStack_ff0;
  undefined4 uStack_fec;
  undefined4 uStack_fe8;
  undefined4 uStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined4 local_de0;
  undefined4 uStack_ddc;
  undefined4 uStack_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  undefined4 uStack_dc8;
  undefined4 uStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float *local_d90;
  float *local_d88;
  undefined1 *local_d80;
  float *local_d78;
  float *local_d70;
  undefined1 *local_d68;
  undefined1 *local_d60;
  undefined8 *local_d58;
  undefined1 *local_d50;
  undefined1 *local_d48;
  undefined8 *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  undefined4 *local_d28;
  undefined1 *local_d20;
  undefined1 *local_d18;
  float *local_d10;
  float *local_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined4 local_c80;
  undefined4 uStack_c7c;
  undefined4 uStack_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined4 uStack_c68;
  undefined4 uStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined4 local_c40;
  undefined4 uStack_c3c;
  undefined4 uStack_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 uStack_c28;
  undefined4 uStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined4 local_c00;
  undefined4 uStack_bfc;
  undefined4 uStack_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 uStack_be8;
  undefined4 uStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined4 local_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float local_a00 [2];
  float afStack_9f8 [2];
  float afStack_9f0 [2];
  float afStack_9e8 [2];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920 [2];
  float afStack_918 [2];
  float afStack_910 [2];
  float afStack_908 [2];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined4 local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 *local_408;
  float *local_400;
  float *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  float *local_3d8;
  float *local_3d0;
  undefined1 *local_3c8;
  float *local_3c0;
  float *local_3b8;
  undefined1 *local_3b0;
  float *local_3a8;
  float *local_3a0;
  undefined1 *local_398;
  float *local_390;
  float *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined8 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined8 *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined4 *local_340;
  undefined1 *local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2910 = *(int *)((long)in_RDI + 0x2c);
  local_2914 = (int)in_RDI[6];
  local_2918 = *(int *)((long)in_RDI + 0x34);
  local_291c = (int)in_RDI[7];
  local_2920 = (int)in_RDI[3];
  local_2924 = local_2910 * local_2914 * local_2918 * local_2920;
  local_2900 = in_RDI;
  for (local_2928 = 0; local_2928 < local_291c; local_2928 = local_2928 + 1) {
    local_28e8 = &local_2978;
    local_27cc = *(int *)((long)local_2900 + 0x2c);
    local_27d0 = (int)local_2900[6];
    local_27d4 = *(undefined4 *)((long)local_2900 + 0x34);
    local_27e0 = (undefined1 (*) [64])
                 (*local_2900 + local_2900[8] * (long)local_2928 * local_2900[2]);
    local_27e8 = local_2900[2];
    local_27ec = (undefined4)local_2900[3];
    local_27f8 = local_2900[4];
    local_27c8 = &local_2978;
    local_27b8 = (long)local_27cc * (long)local_27d0 * local_27e8;
    local_28e0 = &local_2978;
    local_28d0 = &local_2978;
    local_27bc = 0x10;
    local_28f4 = local_2928;
    local_28f5 = 1;
    local_2978 = 0;
    local_2968 = 0;
    local_2960 = 0;
    local_2950 = 0;
    local_294c = 0;
    local_2948 = 0;
    local_2944 = 0;
    local_2940 = 0;
    local_2938 = 0;
    local_2970 = 0;
    local_2930 = local_27e0;
    for (local_297c = 0; uVar62 = local_1100, uVar63 = uStack_10f8, uVar8 = uStack_10f0,
        uVar9 = uStack_10e8, local_297c + 0xf < local_2924; local_297c = local_297c + 0x10) {
      local_28c8 = local_2930;
      auVar59 = *(undefined1 (*) [48])*local_2930;
      uStack_1610 = *(undefined8 *)(*local_2930 + 0x30);
      uStack_1608 = *(undefined8 *)(*local_2930 + 0x38);
      local_2778 = local_2909;
      local_2780 = &local_29c0;
      local_24c0._0_8_ = auVar59._0_8_;
      local_1640 = local_24c0._0_8_;
      local_24c0._8_8_ = auVar59._8_8_;
      uStack_1638 = local_24c0._8_8_;
      local_24c0._16_8_ = auVar59._16_8_;
      uStack_1630 = local_24c0._16_8_;
      local_24c0._24_8_ = auVar59._24_8_;
      uStack_1628 = local_24c0._24_8_;
      local_24c0._32_8_ = auVar59._32_8_;
      uStack_1620 = local_24c0._32_8_;
      local_24c0._40_8_ = auVar59._40_8_;
      uStack_1618 = local_24c0._40_8_;
      local_14c0 = local_24c0._0_8_;
      uStack_14b8 = local_24c0._8_8_;
      uStack_14b0 = local_24c0._16_8_;
      uStack_14a8 = local_24c0._24_8_;
      uStack_14a0 = local_24c0._32_8_;
      uStack_1498 = local_24c0._40_8_;
      local_2344 = 0x7fffffff;
      auVar78 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      local_23c0 = vmovdqa64_avx512f(auVar78);
      auVar78 = vmovdqa64_avx512f(local_23c0);
      local_1500 = vmovdqa64_avx512f(auVar78);
      auVar78 = vmovdqa64_avx512f(*local_2930);
      auVar79 = vmovdqa64_avx512f(local_1500);
      auVar78 = vpandq_avx512f(auVar78,auVar79);
      local_2400 = vmovdqa64_avx512f(auVar78);
      auVar78 = vmovdqa64_avx512f(local_2400);
      auVar78 = vmovdqa64_avx512f(auVar78);
      local_24c0._0_8_ = auVar78._0_8_;
      local_1f00 = local_24c0._0_8_;
      local_24c0._8_8_ = auVar78._8_8_;
      uStack_1ef8 = local_24c0._8_8_;
      local_24c0._16_8_ = auVar78._16_8_;
      uStack_1ef0 = local_24c0._16_8_;
      local_24c0._24_8_ = auVar78._24_8_;
      uStack_1ee8 = local_24c0._24_8_;
      local_24c0._32_8_ = auVar78._32_8_;
      uStack_1ee0 = local_24c0._32_8_;
      local_24c0._40_8_ = auVar78._40_8_;
      uStack_1ed8 = local_24c0._40_8_;
      local_24c0._48_8_ = auVar78._48_8_;
      uStack_1ed0 = local_24c0._48_8_;
      local_24c0._56_8_ = auVar78._56_8_;
      uStack_1ec8 = local_24c0._56_8_;
      local_1f40[0] = 1.2732395;
      local_1f40[1] = 1.2732395;
      afStack_1f38[0] = 1.2732395;
      afStack_1f38[1] = 1.2732395;
      afStack_1f30[0] = 1.2732395;
      afStack_1f30[1] = 1.2732395;
      afStack_1f28[0] = 1.2732395;
      afStack_1f28[1] = 1.2732395;
      afStack_1f20[0] = 1.2732395;
      afStack_1f20[1] = 1.2732395;
      afStack_1f18[0] = 1.2732395;
      afStack_1f18[1] = 1.2732395;
      afStack_1f10[0] = 1.2732395;
      afStack_1f10[1] = 1.2732395;
      afStack_1f08[0] = 1.2732395;
      afStack_1f08[1] = 1.2732395;
      auVar79._8_4_ = 1.2732395;
      auVar79._12_4_ = 1.2732395;
      auVar79._0_4_ = 1.2732395;
      auVar79._4_4_ = 1.2732395;
      auVar79._16_4_ = 1.2732395;
      auVar79._20_4_ = 1.2732395;
      auVar79._24_4_ = 1.2732395;
      auVar79._28_4_ = 1.2732395;
      auVar79._32_4_ = 1.2732395;
      auVar79._36_4_ = 1.2732395;
      auVar79._40_4_ = 1.2732395;
      auVar79._44_4_ = 1.2732395;
      auVar79._48_4_ = 1.2732395;
      auVar79._52_4_ = 1.2732395;
      auVar79._56_4_ = 1.2732395;
      auVar79._60_4_ = 1.2732395;
      auVar79 = vmulps_avx512f(auVar78,auVar79);
      local_25c0 = auVar79._0_8_;
      local_17c0 = local_25c0;
      uStack_25b8 = auVar79._8_8_;
      uStack_17b8 = uStack_25b8;
      uStack_25b0 = auVar79._16_8_;
      uStack_17b0 = uStack_25b0;
      uStack_25a8 = auVar79._24_8_;
      uStack_17a8 = uStack_25a8;
      uStack_25a0 = auVar79._32_8_;
      uStack_17a0 = uStack_25a0;
      uStack_2598 = auVar79._40_8_;
      uStack_1798 = uStack_2598;
      uStack_2590 = auVar79._48_8_;
      uStack_1790 = uStack_2590;
      uStack_2588 = auVar79._56_8_;
      uStack_1788 = uStack_2588;
      auVar79 = vcvttps2dq_avx512f(auVar79);
      local_1680 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar80 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_1);
      local_1740 = vmovdqa64_avx512f(auVar79);
      local_1780 = vmovdqa64_avx512f(auVar80);
      auVar79 = vmovdqa64_avx512f(local_1740);
      auVar80 = vmovdqa64_avx512f(local_1780);
      auVar79 = vpaddd_avx512f(auVar79,auVar80);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar80 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_inv1);
      local_13c0 = vmovdqa64_avx512f(auVar79);
      local_1400 = vmovdqa64_avx512f(auVar80);
      auVar79 = vmovdqa64_avx512f(local_13c0);
      auVar80 = vmovdqa64_avx512f(local_1400);
      auVar79 = vpandq_avx512f(auVar79,auVar80);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar80 = vmovdqa64_avx512f(auVar79);
      local_1580 = vmovdqa64_avx512f(auVar80);
      auVar81 = vcvtdq2ps_avx512f(local_1580);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar80 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_2);
      local_15c0 = vmovdqa64_avx512f(auVar79);
      local_1600 = vmovdqa64_avx512f(auVar80);
      auVar79 = vmovdqa64_avx512f(local_15c0);
      auVar80 = vmovdqa64_avx512f(local_1600);
      auVar79 = vpsubd_avx512f(auVar79,auVar80);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar80 = vmovdqa64_avx512f(auVar79);
      auVar82 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_4);
      local_1240 = vmovdqa64_avx512f(auVar80);
      local_1280 = vmovdqa64_avx512f(auVar82);
      auVar80 = vmovdqa64_avx512f(local_1240);
      auVar82 = vmovdqa64_avx512f(local_1280);
      auVar80 = vpandnq_avx512f(auVar80,auVar82);
      auVar80 = vmovdqa64_avx512f(auVar80);
      auVar80 = vmovdqa64_avx512f(auVar80);
      local_16c0 = vmovdqa64_avx512f(auVar80);
      local_16c4 = 0x1d;
      auVar80 = vmovdqa64_avx512f(local_16c0);
      auVar80 = vpslld_avx512f(auVar80,ZEXT416(0x1d));
      local_2600 = vmovdqa64_avx512f(auVar80);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar80 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_2);
      local_1440 = vmovdqa64_avx512f(auVar79);
      local_1480 = vmovdqa64_avx512f(auVar80);
      auVar79 = vmovdqa64_avx512f(local_1440);
      auVar80 = vmovdqa64_avx512f(local_1480);
      auVar79 = vpandq_avx512f(auVar79,auVar80);
      auVar79 = vmovdqa64_avx512f(auVar79);
      auVar79 = vmovdqa64_avx512f(auVar79);
      uVar6 = vptestnmd_avx512f(auVar79,auVar79);
      local_1502 = (undefined2)uVar6;
      auVar79 = vpmovm2d_avx512dq(uVar6 & 0xffff);
      local_2640 = vmovdqa64_avx512f(auVar79);
      auVar79 = vmovdqa64_avx512f(local_2600);
      local_2440 = vmovdqa64_avx512f(auVar79);
      auVar79 = vmovdqa64_avx512f(local_2440);
      local_2680 = vmovdqa64_avx512f(auVar79);
      auVar79 = vmovdqa64_avx512f(local_2640);
      local_2480 = vmovdqa64_avx512f(auVar79);
      auVar79 = vmovdqa64_avx512f(local_2480);
      local_26c0 = vmovdqa64_avx512f(auVar79);
      local_2500[0] = -0.78515625;
      local_2500[1] = -0.78515625;
      afStack_24f8[0] = -0.78515625;
      afStack_24f8[1] = -0.78515625;
      afStack_24f0[0] = -0.78515625;
      afStack_24f0[1] = -0.78515625;
      afStack_24e8[0] = -0.78515625;
      afStack_24e8[1] = -0.78515625;
      afStack_24e0[0] = -0.78515625;
      afStack_24e0[1] = -0.78515625;
      afStack_24d8[0] = -0.78515625;
      afStack_24d8[1] = -0.78515625;
      afStack_24d0[0] = -0.78515625;
      afStack_24d0[1] = -0.78515625;
      afStack_24c8[0] = -0.78515625;
      afStack_24c8[1] = -0.78515625;
      local_2540[0] = -0.00024187565;
      local_2540[1] = -0.00024187565;
      afStack_2538[0] = -0.00024187565;
      afStack_2538[1] = -0.00024187565;
      afStack_2530[0] = -0.00024187565;
      afStack_2530[1] = -0.00024187565;
      afStack_2528[0] = -0.00024187565;
      afStack_2528[1] = -0.00024187565;
      afStack_2520[0] = -0.00024187565;
      afStack_2520[1] = -0.00024187565;
      afStack_2518[0] = -0.00024187565;
      afStack_2518[1] = -0.00024187565;
      afStack_2510[0] = -0.00024187565;
      afStack_2510[1] = -0.00024187565;
      afStack_2508[0] = -0.00024187565;
      afStack_2508[1] = -0.00024187565;
      local_25c0 = auVar81._0_8_;
      local_1b40 = local_25c0;
      uStack_25b8 = auVar81._8_8_;
      uStack_1b38 = uStack_25b8;
      uStack_25b0 = auVar81._16_8_;
      uStack_1b30 = uStack_25b0;
      uStack_25a8 = auVar81._24_8_;
      uStack_1b28 = uStack_25a8;
      uStack_25a0 = auVar81._32_8_;
      uStack_1b20 = uStack_25a0;
      uStack_2598 = auVar81._40_8_;
      uStack_1b18 = uStack_2598;
      uStack_2590 = auVar81._48_8_;
      uStack_1b10 = uStack_2590;
      uStack_2588 = auVar81._56_8_;
      uStack_1b08 = uStack_2588;
      local_1b80[0] = -0.78515625;
      local_1b80[1] = -0.78515625;
      afStack_1b78[0] = -0.78515625;
      afStack_1b78[1] = -0.78515625;
      afStack_1b70[0] = -0.78515625;
      afStack_1b70[1] = -0.78515625;
      afStack_1b68[0] = -0.78515625;
      afStack_1b68[1] = -0.78515625;
      afStack_1b60[0] = -0.78515625;
      afStack_1b60[1] = -0.78515625;
      afStack_1b58[0] = -0.78515625;
      afStack_1b58[1] = -0.78515625;
      afStack_1b50[0] = -0.78515625;
      afStack_1b50[1] = -0.78515625;
      afStack_1b48[0] = -0.78515625;
      afStack_1b48[1] = -0.78515625;
      local_1bc0 = local_24c0._0_8_;
      uStack_1bb8 = local_24c0._8_8_;
      uStack_1bb0 = local_24c0._16_8_;
      uStack_1ba8 = local_24c0._24_8_;
      uStack_1ba0 = local_24c0._32_8_;
      uStack_1b98 = local_24c0._40_8_;
      uStack_1b90 = local_24c0._48_8_;
      uStack_1b88 = local_24c0._56_8_;
      auVar24._8_4_ = -0.78515625;
      auVar24._12_4_ = -0.78515625;
      auVar24._0_4_ = -0.78515625;
      auVar24._4_4_ = -0.78515625;
      auVar24._16_4_ = -0.78515625;
      auVar24._20_4_ = -0.78515625;
      auVar24._24_4_ = -0.78515625;
      auVar24._28_4_ = -0.78515625;
      auVar24._32_4_ = -0.78515625;
      auVar24._36_4_ = -0.78515625;
      auVar24._40_4_ = -0.78515625;
      auVar24._44_4_ = -0.78515625;
      auVar24._48_4_ = -0.78515625;
      auVar24._52_4_ = -0.78515625;
      auVar24._56_4_ = -0.78515625;
      auVar24._60_4_ = -0.78515625;
      auVar78 = vfmadd213ps_avx512f(auVar24,auVar81,auVar78);
      local_1c00 = local_25c0;
      uStack_1bf8 = uStack_25b8;
      uStack_1bf0 = uStack_25b0;
      uStack_1be8 = uStack_25a8;
      uStack_1be0 = uStack_25a0;
      uStack_1bd8 = uStack_2598;
      uStack_1bd0 = uStack_2590;
      uStack_1bc8 = uStack_2588;
      local_1c40[0] = -0.00024187565;
      local_1c40[1] = -0.00024187565;
      afStack_1c38[0] = -0.00024187565;
      afStack_1c38[1] = -0.00024187565;
      afStack_1c30[0] = -0.00024187565;
      afStack_1c30[1] = -0.00024187565;
      afStack_1c28[0] = -0.00024187565;
      afStack_1c28[1] = -0.00024187565;
      afStack_1c20[0] = -0.00024187565;
      afStack_1c20[1] = -0.00024187565;
      afStack_1c18[0] = -0.00024187565;
      afStack_1c18[1] = -0.00024187565;
      afStack_1c10[0] = -0.00024187565;
      afStack_1c10[1] = -0.00024187565;
      afStack_1c08[0] = -0.00024187565;
      afStack_1c08[1] = -0.00024187565;
      local_24c0._0_8_ = auVar78._0_8_;
      local_1c80 = local_24c0._0_8_;
      local_24c0._8_8_ = auVar78._8_8_;
      uStack_1c78 = local_24c0._8_8_;
      local_24c0._16_8_ = auVar78._16_8_;
      uStack_1c70 = local_24c0._16_8_;
      local_24c0._24_8_ = auVar78._24_8_;
      uStack_1c68 = local_24c0._24_8_;
      local_24c0._32_8_ = auVar78._32_8_;
      uStack_1c60 = local_24c0._32_8_;
      local_24c0._40_8_ = auVar78._40_8_;
      uStack_1c58 = local_24c0._40_8_;
      local_24c0._48_8_ = auVar78._48_8_;
      uStack_1c50 = local_24c0._48_8_;
      local_24c0._56_8_ = auVar78._56_8_;
      uStack_1c48 = local_24c0._56_8_;
      auVar23._8_4_ = -0.00024187565;
      auVar23._12_4_ = -0.00024187565;
      auVar23._0_4_ = -0.00024187565;
      auVar23._4_4_ = -0.00024187565;
      auVar23._16_4_ = -0.00024187565;
      auVar23._20_4_ = -0.00024187565;
      auVar23._24_4_ = -0.00024187565;
      auVar23._28_4_ = -0.00024187565;
      auVar23._32_4_ = -0.00024187565;
      auVar23._36_4_ = -0.00024187565;
      auVar23._40_4_ = -0.00024187565;
      auVar23._44_4_ = -0.00024187565;
      auVar23._48_4_ = -0.00024187565;
      auVar23._52_4_ = -0.00024187565;
      auVar23._56_4_ = -0.00024187565;
      auVar23._60_4_ = -0.00024187565;
      auVar78 = vfmadd213ps_avx512f(auVar23,auVar81,auVar78);
      local_1cc0 = local_25c0;
      uStack_1cb8 = uStack_25b8;
      uStack_1cb0 = uStack_25b0;
      uStack_1ca8 = uStack_25a8;
      uStack_1ca0 = uStack_25a0;
      uStack_1c98 = uStack_2598;
      uStack_1c90 = uStack_2590;
      uStack_1c88 = uStack_2588;
      local_1d00[0] = -3.774895e-08;
      local_1d00[1] = -3.774895e-08;
      afStack_1cf8[0] = -3.774895e-08;
      afStack_1cf8[1] = -3.774895e-08;
      afStack_1cf0[0] = -3.774895e-08;
      afStack_1cf0[1] = -3.774895e-08;
      afStack_1ce8[0] = -3.774895e-08;
      afStack_1ce8[1] = -3.774895e-08;
      afStack_1ce0[0] = -3.774895e-08;
      afStack_1ce0[1] = -3.774895e-08;
      afStack_1cd8[0] = -3.774895e-08;
      afStack_1cd8[1] = -3.774895e-08;
      afStack_1cd0[0] = -3.774895e-08;
      afStack_1cd0[1] = -3.774895e-08;
      afStack_1cc8[0] = -3.774895e-08;
      afStack_1cc8[1] = -3.774895e-08;
      local_24c0._0_8_ = auVar78._0_8_;
      local_1d40 = local_24c0._0_8_;
      local_24c0._8_8_ = auVar78._8_8_;
      uStack_1d38 = local_24c0._8_8_;
      local_24c0._16_8_ = auVar78._16_8_;
      uStack_1d30 = local_24c0._16_8_;
      local_24c0._24_8_ = auVar78._24_8_;
      uStack_1d28 = local_24c0._24_8_;
      local_24c0._32_8_ = auVar78._32_8_;
      uStack_1d20 = local_24c0._32_8_;
      local_24c0._40_8_ = auVar78._40_8_;
      uStack_1d18 = local_24c0._40_8_;
      local_24c0._48_8_ = auVar78._48_8_;
      uStack_1d10 = local_24c0._48_8_;
      local_24c0._56_8_ = auVar78._56_8_;
      uStack_1d08 = local_24c0._56_8_;
      auVar22._8_4_ = -3.774895e-08;
      auVar22._12_4_ = -3.774895e-08;
      auVar22._0_4_ = -3.774895e-08;
      auVar22._4_4_ = -3.774895e-08;
      auVar22._16_4_ = -3.774895e-08;
      auVar22._20_4_ = -3.774895e-08;
      auVar22._24_4_ = -3.774895e-08;
      auVar22._28_4_ = -3.774895e-08;
      auVar22._32_4_ = -3.774895e-08;
      auVar22._36_4_ = -3.774895e-08;
      auVar22._40_4_ = -3.774895e-08;
      auVar22._44_4_ = -3.774895e-08;
      auVar22._48_4_ = -3.774895e-08;
      auVar22._52_4_ = -3.774895e-08;
      auVar22._56_4_ = -3.774895e-08;
      auVar22._60_4_ = -3.774895e-08;
      local_24c0 = vfmadd213ps_avx512f(auVar22,auVar81,auVar78);
      uStack_25b8._0_4_ = 2.4433157e-05;
      uStack_25b8._4_4_ = 2.4433157e-05;
      local_25c0._0_4_ = 2.4433157e-05;
      local_25c0._4_4_ = 2.4433157e-05;
      local_1fc0 = local_24c0._0_8_;
      uStack_1fb8 = local_24c0._8_8_;
      uStack_1fb0 = local_24c0._16_8_;
      uStack_1fa8 = local_24c0._24_8_;
      uStack_1fa0 = local_24c0._32_8_;
      uStack_1f98 = local_24c0._40_8_;
      uStack_1f90 = local_24c0._48_8_;
      uStack_1f88 = local_24c0._56_8_;
      local_2700 = vmulps_avx512f(local_24c0,local_24c0);
      local_1d80[0] = 2.4433157e-05;
      local_1d80[1] = 2.4433157e-05;
      afStack_1d78[0] = 2.4433157e-05;
      afStack_1d78[1] = 2.4433157e-05;
      afStack_1d70[0] = 2.4433157e-05;
      afStack_1d70[1] = 2.4433157e-05;
      afStack_1d68[0] = 2.4433157e-05;
      afStack_1d68[1] = 2.4433157e-05;
      afStack_1d60[0] = 2.4433157e-05;
      afStack_1d60[1] = 2.4433157e-05;
      afStack_1d58[0] = 2.4433157e-05;
      afStack_1d58[1] = 2.4433157e-05;
      afStack_1d50[0] = 2.4433157e-05;
      afStack_1d50[1] = 2.4433157e-05;
      afStack_1d48[0] = 2.4433157e-05;
      afStack_1d48[1] = 2.4433157e-05;
      local_1dc0 = local_2700._0_8_;
      uStack_1db8 = local_2700._8_8_;
      uStack_1db0 = local_2700._16_8_;
      uStack_1da8 = local_2700._24_8_;
      uStack_1da0 = local_2700._32_8_;
      uStack_1d98 = local_2700._40_8_;
      uStack_1d90 = local_2700._48_8_;
      uStack_1d88 = local_2700._56_8_;
      local_1e00[0] = -0.0013887316;
      local_1e00[1] = -0.0013887316;
      afStack_1df8[0] = -0.0013887316;
      afStack_1df8[1] = -0.0013887316;
      afStack_1df0[0] = -0.0013887316;
      afStack_1df0[1] = -0.0013887316;
      afStack_1de8[0] = -0.0013887316;
      afStack_1de8[1] = -0.0013887316;
      afStack_1de0[0] = -0.0013887316;
      afStack_1de0[1] = -0.0013887316;
      afStack_1dd8[0] = -0.0013887316;
      afStack_1dd8[1] = -0.0013887316;
      afStack_1dd0[0] = -0.0013887316;
      afStack_1dd0[1] = -0.0013887316;
      afStack_1dc8[0] = -0.0013887316;
      afStack_1dc8[1] = -0.0013887316;
      auVar82._16_4_ = 2.4433157e-05;
      auVar82._20_4_ = 2.4433157e-05;
      auVar82._0_16_ = _local_25c0;
      auVar82._24_4_ = 2.4433157e-05;
      auVar82._28_4_ = 2.4433157e-05;
      auVar82._32_4_ = 2.4433157e-05;
      auVar82._36_4_ = 2.4433157e-05;
      auVar82._40_4_ = 2.4433157e-05;
      auVar82._44_4_ = 2.4433157e-05;
      auVar82._48_4_ = 2.4433157e-05;
      auVar82._52_4_ = 2.4433157e-05;
      auVar82._56_4_ = 2.4433157e-05;
      auVar82._60_4_ = 2.4433157e-05;
      auVar81._8_4_ = -0.0013887316;
      auVar81._12_4_ = -0.0013887316;
      auVar81._0_4_ = -0.0013887316;
      auVar81._4_4_ = -0.0013887316;
      auVar81._16_4_ = -0.0013887316;
      auVar81._20_4_ = -0.0013887316;
      auVar81._24_4_ = -0.0013887316;
      auVar81._28_4_ = -0.0013887316;
      auVar81._32_4_ = -0.0013887316;
      auVar81._36_4_ = -0.0013887316;
      auVar81._40_4_ = -0.0013887316;
      auVar81._44_4_ = -0.0013887316;
      auVar81._48_4_ = -0.0013887316;
      auVar81._52_4_ = -0.0013887316;
      auVar81._56_4_ = -0.0013887316;
      auVar81._60_4_ = -0.0013887316;
      auVar78 = vfmadd213ps_avx512f(local_2700,auVar82,auVar81);
      local_25c0 = auVar78._0_8_;
      local_1e40 = local_25c0;
      uStack_25b8 = auVar78._8_8_;
      uStack_1e38 = uStack_25b8;
      uStack_25b0 = auVar78._16_8_;
      uStack_1e30 = uStack_25b0;
      uStack_25a8 = auVar78._24_8_;
      uStack_1e28 = uStack_25a8;
      uStack_25a0 = auVar78._32_8_;
      uStack_1e20 = uStack_25a0;
      uStack_2598 = auVar78._40_8_;
      uStack_1e18 = uStack_2598;
      uStack_2590 = auVar78._48_8_;
      uStack_1e10 = uStack_2590;
      uStack_2588 = auVar78._56_8_;
      uStack_1e08 = uStack_2588;
      local_1e80 = local_2700._0_8_;
      uStack_1e78 = local_2700._8_8_;
      uStack_1e70 = local_2700._16_8_;
      uStack_1e68 = local_2700._24_8_;
      uStack_1e60 = local_2700._32_8_;
      uStack_1e58 = local_2700._40_8_;
      uStack_1e50 = local_2700._48_8_;
      uStack_1e48 = local_2700._56_8_;
      local_1ec0[0] = 0.041666646;
      local_1ec0[1] = 0.041666646;
      afStack_1eb8[0] = 0.041666646;
      afStack_1eb8[1] = 0.041666646;
      afStack_1eb0[0] = 0.041666646;
      afStack_1eb0[1] = 0.041666646;
      afStack_1ea8[0] = 0.041666646;
      afStack_1ea8[1] = 0.041666646;
      afStack_1ea0[0] = 0.041666646;
      afStack_1ea0[1] = 0.041666646;
      afStack_1e98[0] = 0.041666646;
      afStack_1e98[1] = 0.041666646;
      afStack_1e90[0] = 0.041666646;
      afStack_1e90[1] = 0.041666646;
      afStack_1e88[0] = 0.041666646;
      afStack_1e88[1] = 0.041666646;
      auVar80._8_4_ = 0.041666646;
      auVar80._12_4_ = 0.041666646;
      auVar80._0_4_ = 0.041666646;
      auVar80._4_4_ = 0.041666646;
      auVar80._16_4_ = 0.041666646;
      auVar80._20_4_ = 0.041666646;
      auVar80._24_4_ = 0.041666646;
      auVar80._28_4_ = 0.041666646;
      auVar80._32_4_ = 0.041666646;
      auVar80._36_4_ = 0.041666646;
      auVar80._40_4_ = 0.041666646;
      auVar80._44_4_ = 0.041666646;
      auVar80._48_4_ = 0.041666646;
      auVar80._52_4_ = 0.041666646;
      auVar80._56_4_ = 0.041666646;
      auVar80._60_4_ = 0.041666646;
      auVar78 = vfmadd213ps_avx512f(local_2700,auVar78,auVar80);
      local_25c0 = auVar78._0_8_;
      local_2000 = local_25c0;
      uStack_25b8 = auVar78._8_8_;
      uStack_1ff8 = uStack_25b8;
      uStack_25b0 = auVar78._16_8_;
      uStack_1ff0 = uStack_25b0;
      uStack_25a8 = auVar78._24_8_;
      uStack_1fe8 = uStack_25a8;
      uStack_25a0 = auVar78._32_8_;
      uStack_1fe0 = uStack_25a0;
      uStack_2598 = auVar78._40_8_;
      uStack_1fd8 = uStack_2598;
      uStack_2590 = auVar78._48_8_;
      uStack_1fd0 = uStack_2590;
      uStack_2588 = auVar78._56_8_;
      uStack_1fc8 = uStack_2588;
      local_2040 = local_2700._0_8_;
      uStack_2038 = local_2700._8_8_;
      uStack_2030 = local_2700._16_8_;
      uStack_2028 = local_2700._24_8_;
      uStack_2020 = local_2700._32_8_;
      uStack_2018 = local_2700._40_8_;
      uStack_2010 = local_2700._48_8_;
      uStack_2008 = local_2700._56_8_;
      auVar78 = vmulps_avx512f(auVar78,local_2700);
      local_25c0 = auVar78._0_8_;
      local_2080 = local_25c0;
      uStack_25b8 = auVar78._8_8_;
      uStack_2078 = uStack_25b8;
      uStack_25b0 = auVar78._16_8_;
      uStack_2070 = uStack_25b0;
      uStack_25a8 = auVar78._24_8_;
      uStack_2068 = uStack_25a8;
      uStack_25a0 = auVar78._32_8_;
      uStack_2060 = uStack_25a0;
      uStack_2598 = auVar78._40_8_;
      uStack_2058 = uStack_2598;
      uStack_2590 = auVar78._48_8_;
      uStack_2050 = uStack_2590;
      uStack_2588 = auVar78._56_8_;
      uStack_2048 = uStack_2588;
      local_20c0 = local_2700._0_8_;
      uStack_20b8 = local_2700._8_8_;
      uStack_20b0 = local_2700._16_8_;
      uStack_20a8 = local_2700._24_8_;
      uStack_20a0 = local_2700._32_8_;
      uStack_2098 = local_2700._40_8_;
      uStack_2090 = local_2700._48_8_;
      uStack_2088 = local_2700._56_8_;
      auVar78 = vmulps_avx512f(auVar78,local_2700);
      local_1a80 = local_2700._0_8_;
      uStack_1a78 = local_2700._8_8_;
      uStack_1a70 = local_2700._16_8_;
      uStack_1a68 = local_2700._24_8_;
      uStack_1a60 = local_2700._32_8_;
      uStack_1a58 = local_2700._40_8_;
      uStack_1a50 = local_2700._48_8_;
      uStack_1a48 = local_2700._56_8_;
      local_1ac0[0] = 0.5;
      local_1ac0[1] = 0.5;
      afStack_1ab8[0] = 0.5;
      afStack_1ab8[1] = 0.5;
      afStack_1ab0[0] = 0.5;
      afStack_1ab0[1] = 0.5;
      afStack_1aa8[0] = 0.5;
      afStack_1aa8[1] = 0.5;
      afStack_1aa0[0] = 0.5;
      afStack_1aa0[1] = 0.5;
      afStack_1a98[0] = 0.5;
      afStack_1a98[1] = 0.5;
      afStack_1a90[0] = 0.5;
      afStack_1a90[1] = 0.5;
      afStack_1a88[0] = 0.5;
      afStack_1a88[1] = 0.5;
      local_25c0 = auVar78._0_8_;
      local_1b00 = local_25c0;
      uStack_25b8 = auVar78._8_8_;
      uStack_1af8 = uStack_25b8;
      uStack_25b0 = auVar78._16_8_;
      uStack_1af0 = uStack_25b0;
      uStack_25a8 = auVar78._24_8_;
      uStack_1ae8 = uStack_25a8;
      uStack_25a0 = auVar78._32_8_;
      uStack_1ae0 = uStack_25a0;
      uStack_2598 = auVar78._40_8_;
      uStack_1ad8 = uStack_2598;
      uStack_2590 = auVar78._48_8_;
      uStack_1ad0 = uStack_2590;
      uStack_2588 = auVar78._56_8_;
      uStack_1ac8 = uStack_2588;
      auVar25._8_4_ = 0.5;
      auVar25._12_4_ = 0.5;
      auVar25._0_4_ = 0.5;
      auVar25._4_4_ = 0.5;
      auVar25._16_4_ = 0.5;
      auVar25._20_4_ = 0.5;
      auVar25._24_4_ = 0.5;
      auVar25._28_4_ = 0.5;
      auVar25._32_4_ = 0.5;
      auVar25._36_4_ = 0.5;
      auVar25._40_4_ = 0.5;
      auVar25._44_4_ = 0.5;
      auVar25._48_4_ = 0.5;
      auVar25._52_4_ = 0.5;
      auVar25._56_4_ = 0.5;
      auVar25._60_4_ = 0.5;
      auVar78 = vfnmadd213ps_avx512f(auVar25,local_2700,auVar78);
      local_25c0 = auVar78._0_8_;
      local_1800 = local_25c0;
      uStack_25b8 = auVar78._8_8_;
      uStack_17f8 = uStack_25b8;
      uStack_25b0 = auVar78._16_8_;
      uStack_17f0 = uStack_25b0;
      uStack_25a8 = auVar78._24_8_;
      uStack_17e8 = uStack_25a8;
      uStack_25a0 = auVar78._32_8_;
      uStack_17e0 = uStack_25a0;
      uStack_2598 = auVar78._40_8_;
      uStack_17d8 = uStack_2598;
      uStack_2590 = auVar78._48_8_;
      uStack_17d0 = uStack_2590;
      uStack_2588 = auVar78._56_8_;
      uStack_17c8 = uStack_2588;
      local_1840[0] = 1.0;
      local_1840[1] = 1.0;
      afStack_1838[0] = 1.0;
      afStack_1838[1] = 1.0;
      afStack_1830[0] = 1.0;
      afStack_1830[1] = 1.0;
      afStack_1828[0] = 1.0;
      afStack_1828[1] = 1.0;
      afStack_1820[0] = 1.0;
      afStack_1820[1] = 1.0;
      afStack_1818[0] = 1.0;
      afStack_1818[1] = 1.0;
      afStack_1810[0] = 1.0;
      afStack_1810[1] = 1.0;
      afStack_1808[0] = 1.0;
      afStack_1808[1] = 1.0;
      auVar28._8_4_ = 1.0;
      auVar28._12_4_ = 1.0;
      auVar28._0_4_ = 1.0;
      auVar28._4_4_ = 1.0;
      auVar28._16_4_ = 1.0;
      auVar28._20_4_ = 1.0;
      auVar28._24_4_ = 1.0;
      auVar28._28_4_ = 1.0;
      auVar28._32_4_ = 1.0;
      auVar28._36_4_ = 1.0;
      auVar28._40_4_ = 1.0;
      auVar28._44_4_ = 1.0;
      auVar28._48_4_ = 1.0;
      auVar28._52_4_ = 1.0;
      auVar28._56_4_ = 1.0;
      auVar28._60_4_ = 1.0;
      auVar79 = vaddps_avx512f(auVar78,auVar28);
      uStack_2738._0_4_ = -0.00019515296;
      uStack_2738._4_4_ = -0.00019515296;
      local_2740._0_4_ = -0.00019515296;
      local_2740._4_4_ = -0.00019515296;
      local_2100[0] = -0.00019515296;
      local_2100[1] = -0.00019515296;
      afStack_20f8[0] = -0.00019515296;
      afStack_20f8[1] = -0.00019515296;
      afStack_20f0[0] = -0.00019515296;
      afStack_20f0[1] = -0.00019515296;
      afStack_20e8[0] = -0.00019515296;
      afStack_20e8[1] = -0.00019515296;
      afStack_20e0[0] = -0.00019515296;
      afStack_20e0[1] = -0.00019515296;
      afStack_20d8[0] = -0.00019515296;
      afStack_20d8[1] = -0.00019515296;
      afStack_20d0[0] = -0.00019515296;
      afStack_20d0[1] = -0.00019515296;
      afStack_20c8[0] = -0.00019515296;
      afStack_20c8[1] = -0.00019515296;
      local_2140 = local_2700._0_8_;
      uStack_2138 = local_2700._8_8_;
      uStack_2130 = local_2700._16_8_;
      uStack_2128 = local_2700._24_8_;
      uStack_2120 = local_2700._32_8_;
      uStack_2118 = local_2700._40_8_;
      uStack_2110 = local_2700._48_8_;
      uStack_2108 = local_2700._56_8_;
      auVar78._16_4_ = -0.00019515296;
      auVar78._20_4_ = -0.00019515296;
      auVar78._0_16_ = _local_2740;
      auVar78._24_4_ = -0.00019515296;
      auVar78._28_4_ = -0.00019515296;
      auVar78._32_4_ = -0.00019515296;
      auVar78._36_4_ = -0.00019515296;
      auVar78._40_4_ = -0.00019515296;
      auVar78._44_4_ = -0.00019515296;
      auVar78._48_4_ = -0.00019515296;
      auVar78._52_4_ = -0.00019515296;
      auVar78._56_4_ = -0.00019515296;
      auVar78._60_4_ = -0.00019515296;
      auVar78 = vmulps_avx512f(auVar78,local_2700);
      local_2740 = auVar78._0_8_;
      local_1880 = local_2740;
      uStack_2738 = auVar78._8_8_;
      uStack_1878 = uStack_2738;
      uStack_2730 = auVar78._16_8_;
      uStack_1870 = uStack_2730;
      uStack_2728 = auVar78._24_8_;
      uStack_1868 = uStack_2728;
      uStack_2720 = auVar78._32_8_;
      uStack_1860 = uStack_2720;
      uStack_2718 = auVar78._40_8_;
      uStack_1858 = uStack_2718;
      uStack_2710 = auVar78._48_8_;
      uStack_1850 = uStack_2710;
      uStack_2708 = auVar78._56_8_;
      uStack_1848 = uStack_2708;
      local_18c0[0] = 0.008332161;
      local_18c0[1] = 0.008332161;
      afStack_18b8[0] = 0.008332161;
      afStack_18b8[1] = 0.008332161;
      afStack_18b0[0] = 0.008332161;
      afStack_18b0[1] = 0.008332161;
      afStack_18a8[0] = 0.008332161;
      afStack_18a8[1] = 0.008332161;
      afStack_18a0[0] = 0.008332161;
      afStack_18a0[1] = 0.008332161;
      afStack_1898[0] = 0.008332161;
      afStack_1898[1] = 0.008332161;
      afStack_1890[0] = 0.008332161;
      afStack_1890[1] = 0.008332161;
      afStack_1888[0] = 0.008332161;
      afStack_1888[1] = 0.008332161;
      auVar27._8_4_ = 0.008332161;
      auVar27._12_4_ = 0.008332161;
      auVar27._0_4_ = 0.008332161;
      auVar27._4_4_ = 0.008332161;
      auVar27._16_4_ = 0.008332161;
      auVar27._20_4_ = 0.008332161;
      auVar27._24_4_ = 0.008332161;
      auVar27._28_4_ = 0.008332161;
      auVar27._32_4_ = 0.008332161;
      auVar27._36_4_ = 0.008332161;
      auVar27._40_4_ = 0.008332161;
      auVar27._44_4_ = 0.008332161;
      auVar27._48_4_ = 0.008332161;
      auVar27._52_4_ = 0.008332161;
      auVar27._56_4_ = 0.008332161;
      auVar27._60_4_ = 0.008332161;
      auVar78 = vaddps_avx512f(auVar78,auVar27);
      local_2740 = auVar78._0_8_;
      local_2180 = local_2740;
      uStack_2738 = auVar78._8_8_;
      uStack_2178 = uStack_2738;
      uStack_2730 = auVar78._16_8_;
      uStack_2170 = uStack_2730;
      uStack_2728 = auVar78._24_8_;
      uStack_2168 = uStack_2728;
      uStack_2720 = auVar78._32_8_;
      uStack_2160 = uStack_2720;
      uStack_2718 = auVar78._40_8_;
      uStack_2158 = uStack_2718;
      uStack_2710 = auVar78._48_8_;
      uStack_2150 = uStack_2710;
      uStack_2708 = auVar78._56_8_;
      uStack_2148 = uStack_2708;
      local_21c0 = local_2700._0_8_;
      uStack_21b8 = local_2700._8_8_;
      uStack_21b0 = local_2700._16_8_;
      uStack_21a8 = local_2700._24_8_;
      uStack_21a0 = local_2700._32_8_;
      uStack_2198 = local_2700._40_8_;
      uStack_2190 = local_2700._48_8_;
      uStack_2188 = local_2700._56_8_;
      auVar78 = vmulps_avx512f(auVar78,local_2700);
      local_2740 = auVar78._0_8_;
      local_1900 = local_2740;
      uStack_2738 = auVar78._8_8_;
      uStack_18f8 = uStack_2738;
      uStack_2730 = auVar78._16_8_;
      uStack_18f0 = uStack_2730;
      uStack_2728 = auVar78._24_8_;
      uStack_18e8 = uStack_2728;
      uStack_2720 = auVar78._32_8_;
      uStack_18e0 = uStack_2720;
      uStack_2718 = auVar78._40_8_;
      uStack_18d8 = uStack_2718;
      uStack_2710 = auVar78._48_8_;
      uStack_18d0 = uStack_2710;
      uStack_2708 = auVar78._56_8_;
      uStack_18c8 = uStack_2708;
      local_1940[0] = -0.16666655;
      local_1940[1] = -0.16666655;
      afStack_1938[0] = -0.16666655;
      afStack_1938[1] = -0.16666655;
      afStack_1930[0] = -0.16666655;
      afStack_1930[1] = -0.16666655;
      afStack_1928[0] = -0.16666655;
      afStack_1928[1] = -0.16666655;
      afStack_1920[0] = -0.16666655;
      afStack_1920[1] = -0.16666655;
      afStack_1918[0] = -0.16666655;
      afStack_1918[1] = -0.16666655;
      afStack_1910[0] = -0.16666655;
      afStack_1910[1] = -0.16666655;
      afStack_1908[0] = -0.16666655;
      afStack_1908[1] = -0.16666655;
      auVar26._8_4_ = -0.16666655;
      auVar26._12_4_ = -0.16666655;
      auVar26._0_4_ = -0.16666655;
      auVar26._4_4_ = -0.16666655;
      auVar26._16_4_ = -0.16666655;
      auVar26._20_4_ = -0.16666655;
      auVar26._24_4_ = -0.16666655;
      auVar26._28_4_ = -0.16666655;
      auVar26._32_4_ = -0.16666655;
      auVar26._36_4_ = -0.16666655;
      auVar26._40_4_ = -0.16666655;
      auVar26._44_4_ = -0.16666655;
      auVar26._48_4_ = -0.16666655;
      auVar26._52_4_ = -0.16666655;
      auVar26._56_4_ = -0.16666655;
      auVar26._60_4_ = -0.16666655;
      auVar78 = vaddps_avx512f(auVar78,auVar26);
      local_2740 = auVar78._0_8_;
      local_2200 = local_2740;
      uStack_2738 = auVar78._8_8_;
      uStack_21f8 = uStack_2738;
      uStack_2730 = auVar78._16_8_;
      uStack_21f0 = uStack_2730;
      uStack_2728 = auVar78._24_8_;
      uStack_21e8 = uStack_2728;
      uStack_2720 = auVar78._32_8_;
      uStack_21e0 = uStack_2720;
      uStack_2718 = auVar78._40_8_;
      uStack_21d8 = uStack_2718;
      uStack_2710 = auVar78._48_8_;
      uStack_21d0 = uStack_2710;
      uStack_2708 = auVar78._56_8_;
      uStack_21c8 = uStack_2708;
      local_2240 = local_2700._0_8_;
      uStack_2238 = local_2700._8_8_;
      uStack_2230 = local_2700._16_8_;
      uStack_2228 = local_2700._24_8_;
      uStack_2220 = local_2700._32_8_;
      uStack_2218 = local_2700._40_8_;
      uStack_2210 = local_2700._48_8_;
      uStack_2208 = local_2700._56_8_;
      auVar78 = vmulps_avx512f(auVar78,local_2700);
      local_2740 = auVar78._0_8_;
      local_2280 = local_2740;
      uStack_2738 = auVar78._8_8_;
      uStack_2278 = uStack_2738;
      uStack_2730 = auVar78._16_8_;
      uStack_2270 = uStack_2730;
      uStack_2728 = auVar78._24_8_;
      uStack_2268 = uStack_2728;
      uStack_2720 = auVar78._32_8_;
      uStack_2260 = uStack_2720;
      uStack_2718 = auVar78._40_8_;
      uStack_2258 = uStack_2718;
      uStack_2710 = auVar78._48_8_;
      uStack_2250 = uStack_2710;
      uStack_2708 = auVar78._56_8_;
      uStack_2248 = uStack_2708;
      local_22c0 = local_24c0._0_8_;
      uStack_22b8 = local_24c0._8_8_;
      uStack_22b0 = local_24c0._16_8_;
      uStack_22a8 = local_24c0._24_8_;
      uStack_22a0 = local_24c0._32_8_;
      uStack_2298 = local_24c0._40_8_;
      uStack_2290 = local_24c0._48_8_;
      uStack_2288 = local_24c0._56_8_;
      auVar78 = vmulps_avx512f(auVar78,local_24c0);
      local_2740 = auVar78._0_8_;
      local_1980 = local_2740;
      uStack_2738 = auVar78._8_8_;
      uStack_1978 = uStack_2738;
      uStack_2730 = auVar78._16_8_;
      uStack_1970 = uStack_2730;
      uStack_2728 = auVar78._24_8_;
      uStack_1968 = uStack_2728;
      uStack_2720 = auVar78._32_8_;
      uStack_1960 = uStack_2720;
      uStack_2718 = auVar78._40_8_;
      uStack_1958 = uStack_2718;
      uStack_2710 = auVar78._48_8_;
      uStack_1950 = uStack_2710;
      uStack_2708 = auVar78._56_8_;
      uStack_1948 = uStack_2708;
      local_19c0 = local_24c0._0_8_;
      uStack_19b8 = local_24c0._8_8_;
      uStack_19b0 = local_24c0._16_8_;
      uStack_19a8 = local_24c0._24_8_;
      uStack_19a0 = local_24c0._32_8_;
      uStack_1998 = local_24c0._40_8_;
      uStack_1990 = local_24c0._48_8_;
      uStack_1988 = local_24c0._56_8_;
      auVar78 = vaddps_avx512f(auVar78,local_24c0);
      local_2580 = local_26c0._0_8_;
      uStack_2578 = local_26c0._8_8_;
      uStack_2570 = local_26c0._16_8_;
      uStack_2568 = local_26c0._24_8_;
      uStack_2560 = local_26c0._32_8_;
      uStack_2558 = local_26c0._40_8_;
      uStack_2550 = local_26c0._48_8_;
      uStack_2548 = local_26c0._56_8_;
      local_2300 = local_26c0._0_8_;
      uStack_22f8 = local_26c0._8_8_;
      uStack_22f0 = local_26c0._16_8_;
      uStack_22e8 = local_26c0._24_8_;
      uStack_22e0 = local_26c0._32_8_;
      uStack_22d8 = local_26c0._40_8_;
      uStack_22d0 = local_26c0._48_8_;
      uStack_22c8 = local_26c0._56_8_;
      local_2740 = auVar78._0_8_;
      local_2340 = local_2740;
      uStack_2738 = auVar78._8_8_;
      uStack_2338 = uStack_2738;
      uStack_2730 = auVar78._16_8_;
      uStack_2330 = uStack_2730;
      uStack_2728 = auVar78._24_8_;
      uStack_2328 = uStack_2728;
      uStack_2720 = auVar78._32_8_;
      uStack_2320 = uStack_2720;
      uStack_2718 = auVar78._40_8_;
      uStack_2318 = uStack_2718;
      uStack_2710 = auVar78._48_8_;
      uStack_2310 = uStack_2710;
      uStack_2708 = auVar78._56_8_;
      uStack_2308 = uStack_2708;
      auVar80 = vmovdqa64_avx512f(local_26c0);
      auVar78 = vmovdqa64_avx512f(auVar78);
      auVar78 = vpandd_avx512f(auVar80,auVar78);
      _local_2740 = vmovdqa64_avx512f(auVar78);
      local_12c0 = local_26c0._0_8_;
      uStack_12b8 = local_26c0._8_8_;
      uStack_12b0 = local_26c0._16_8_;
      uStack_12a8 = local_26c0._24_8_;
      uStack_12a0 = local_26c0._32_8_;
      uStack_1298 = local_26c0._40_8_;
      uStack_1290 = local_26c0._48_8_;
      uStack_1288 = local_26c0._56_8_;
      local_25c0 = auVar79._0_8_;
      local_1300 = local_25c0;
      uStack_25b8 = auVar79._8_8_;
      uStack_12f8 = uStack_25b8;
      uStack_25b0 = auVar79._16_8_;
      uStack_12f0 = uStack_25b0;
      uStack_25a8 = auVar79._24_8_;
      uStack_12e8 = uStack_25a8;
      uStack_25a0 = auVar79._32_8_;
      uStack_12e0 = uStack_25a0;
      uStack_2598 = auVar79._40_8_;
      uStack_12d8 = uStack_2598;
      uStack_2590 = auVar79._48_8_;
      uStack_12d0 = uStack_2590;
      uStack_2588 = auVar79._56_8_;
      uStack_12c8 = uStack_2588;
      auVar78 = vmovdqa64_avx512f(local_26c0);
      auVar78 = vpternlogq_avx512f(auVar78,auVar78,auVar78,0xf);
      auVar78 = vpandd_avx512f(auVar78,auVar79);
      local_25c0 = auVar78._0_8_;
      local_1a00 = local_25c0;
      uStack_25b8 = auVar78._8_8_;
      uStack_19f8 = uStack_25b8;
      uStack_25b0 = auVar78._16_8_;
      uStack_19f0 = uStack_25b0;
      uStack_25a8 = auVar78._24_8_;
      uStack_19e8 = uStack_25a8;
      uStack_25a0 = auVar78._32_8_;
      uStack_19e0 = uStack_25a0;
      uStack_2598 = auVar78._40_8_;
      uStack_19d8 = uStack_2598;
      uStack_2590 = auVar78._48_8_;
      uStack_19d0 = uStack_2590;
      uStack_2588 = auVar78._56_8_;
      uStack_19c8 = uStack_2588;
      local_1a40 = local_2740;
      uStack_1a38 = uStack_2738;
      uStack_1a30 = uStack_2730;
      uStack_1a28 = uStack_2728;
      uStack_1a20 = uStack_2720;
      uStack_1a18 = uStack_2718;
      uStack_1a10 = uStack_2710;
      uStack_1a08 = uStack_2708;
      auVar78 = vaddps_avx512f(auVar78,_local_2740);
      local_25c0 = auVar78._0_8_;
      local_1340 = local_25c0;
      uStack_25b8 = auVar78._8_8_;
      uStack_1338 = uStack_25b8;
      uStack_25b0 = auVar78._16_8_;
      uStack_1330 = uStack_25b0;
      uStack_25a8 = auVar78._24_8_;
      uStack_1328 = uStack_25a8;
      uStack_25a0 = auVar78._32_8_;
      uStack_1320 = uStack_25a0;
      uStack_2598 = auVar78._40_8_;
      uStack_1318 = uStack_2598;
      uStack_2590 = auVar78._48_8_;
      uStack_1310 = uStack_2590;
      uStack_2588 = auVar78._56_8_;
      uStack_1308 = uStack_2588;
      local_1380 = local_2680._0_8_;
      uStack_1378 = local_2680._8_8_;
      uStack_1370 = local_2680._16_8_;
      uStack_1368 = local_2680._24_8_;
      uStack_1360 = local_2680._32_8_;
      uStack_1358 = local_2680._40_8_;
      uStack_1350 = local_2680._48_8_;
      uStack_1348 = local_2680._56_8_;
      _local_25c0 = vpxord_avx512f(auVar78,local_2680);
      local_29c0 = local_25c0;
      uStack_29b8 = uStack_25b8;
      uStack_29b0 = uStack_25b0;
      uStack_29a8 = uStack_25a8;
      uStack_29a0 = uStack_25a0;
      uStack_2998 = uStack_2598;
      uStack_2990 = uStack_2590;
      uStack_2988 = uStack_2588;
      local_2850 = local_2930;
      local_28c0 = local_25c0;
      uStack_28b8 = uStack_25b8;
      uStack_28b0 = uStack_25b0;
      uStack_28a8 = uStack_25a8;
      uStack_28a0 = uStack_25a0;
      uStack_2898 = uStack_2598;
      uStack_2890 = uStack_2590;
      uStack_2888 = uStack_2588;
      *local_2930 = _local_25c0;
      local_2930 = local_2930 + 1;
      local_1f80 = local_1fc0;
      uStack_1f78 = uStack_1fb8;
      uStack_1f70 = uStack_1fb0;
      uStack_1f68 = uStack_1fa8;
      uStack_1f60 = uStack_1fa0;
      uStack_1f58 = uStack_1f98;
      uStack_1f50 = uStack_1f90;
      uStack_1f48 = uStack_1f88;
      uStack_1490 = uStack_1610;
      uStack_1488 = uStack_1608;
    }
    for (; uStack_10e8 = uVar9, uStack_10f0 = uVar8, uStack_10f8 = uVar63, local_1100 = uVar62,
        uVar67 = uStack_10e8._4_4_, uVar66 = uStack_10f0._4_4_, uVar65 = uStack_10f8._4_4_,
        uVar64 = local_1100._4_4_, uVar62 = local_5c0, uVar63 = uStack_5b8,
        local_297c + 7 < local_2924; local_297c = local_297c + 8) {
      local_2848 = local_2930;
      uStack_fd0 = *(undefined8 *)(*local_2930 + 0x10);
      uStack_fc8 = *(undefined8 *)(*local_2930 + 0x18);
      local_2768 = local_2909;
      local_2770 = &local_29e0;
      local_fc0 = 0;
      uStack_fb8 = 0;
      uStack_fb0 = 0;
      uStack_fa8 = 0;
      local_10a0._0_8_ = SUB168(*(undefined1 (*) [16])*local_2930,0);
      local_fe0 = local_10a0._0_8_;
      local_10a0._8_8_ = SUB168(*(undefined1 (*) [16])*local_2930,8);
      uStack_fd8 = local_10a0._8_8_;
      local_1000 = 0x7fffffff;
      uStack_ffc = 0x7fffffff;
      uStack_ff8 = 0x7fffffff;
      uStack_ff4 = 0x7fffffff;
      uStack_ff0 = 0x7fffffff;
      uStack_fec = 0x7fffffff;
      uStack_fe8 = 0x7fffffff;
      uStack_fe4 = 0x7fffffff;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar3._16_4_ = 0x7fffffff;
      auVar3._20_4_ = 0x7fffffff;
      auVar3._24_4_ = 0x7fffffff;
      auVar3._28_4_ = 0x7fffffff;
      auVar3 = vpand_avx2(*(undefined1 (*) [32])*local_2930,auVar3);
      local_10a0._0_8_ = auVar3._0_8_;
      uVar10 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar3._8_8_;
      uVar11 = local_10a0._8_8_;
      local_10a0._16_8_ = auVar3._16_8_;
      uVar12 = local_10a0._16_8_;
      local_10a0._24_8_ = auVar3._24_8_;
      uVar13 = local_10a0._24_8_;
      local_de0 = 0x3fa2f983;
      uStack_ddc = 0x3fa2f983;
      uStack_dd8 = 0x3fa2f983;
      uStack_dd4 = 0x3fa2f983;
      uStack_dd0 = 0x3fa2f983;
      uStack_dcc = 0x3fa2f983;
      uStack_dc8 = 0x3fa2f983;
      uStack_dc4 = 0x3fa2f983;
      local_dc0._0_4_ = auVar3._0_4_;
      local_dc0._4_4_ = auVar3._4_4_;
      uStack_db8._0_4_ = auVar3._8_4_;
      uStack_db8._4_4_ = auVar3._12_4_;
      uStack_db0._0_4_ = auVar3._16_4_;
      uStack_db0._4_4_ = auVar3._20_4_;
      uStack_da8._0_4_ = auVar3._24_4_;
      uStack_da8._4_4_ = auVar3._28_4_;
      local_1120._4_4_ = local_dc0._4_4_ * 1.2732395;
      local_1120._0_4_ = (float)local_dc0 * 1.2732395;
      uStack_1118._0_4_ = (float)uStack_db8 * 1.2732395;
      uStack_1118._4_4_ = uStack_db8._4_4_ * 1.2732395;
      uStack_1110._0_4_ = (float)uStack_db0 * 1.2732395;
      uStack_1110._4_4_ = uStack_db0._4_4_ * 1.2732395;
      auVar60 = _local_1120;
      uStack_1108._0_4_ = (float)uStack_da8 * 1.2732395;
      uStack_1108._4_4_ = uStack_da8._4_4_;
      auVar77 = _local_1120;
      local_bc0 = local_1120;
      uStack_bb8 = uStack_1118;
      uStack_1110 = auVar60._16_8_;
      uStack_bb0 = uStack_1110;
      uStack_1108 = auVar77._24_8_;
      uStack_ba8 = uStack_1108;
      local_1160._4_4_ = (int)(local_dc0._4_4_ * 1.2732395);
      local_1160._0_4_ = (int)((float)local_dc0 * 1.2732395);
      local_1160._8_4_ = (int)((float)uStack_db8 * 1.2732395);
      local_1160._12_4_ = (int)(uStack_db8._4_4_ * 1.2732395);
      local_1160._16_4_ = (int)((float)uStack_db0 * 1.2732395);
      local_1160._20_4_ = (int)(uStack_db0._4_4_ * 1.2732395);
      auVar60 = local_1160._0_24_;
      local_1160._24_4_ = (int)((float)uStack_da8 * 1.2732395);
      local_1160._28_4_ = (int)uStack_da8._4_4_;
      auVar77 = local_1160;
      local_b80 = local_1160._0_8_;
      uStack_b78 = local_1160._8_8_;
      local_1160._16_8_ = auVar60._16_8_;
      uStack_b70 = local_1160._16_8_;
      local_1160._24_8_ = auVar77._24_8_;
      uStack_b68 = local_1160._24_8_;
      local_ba0 = 0x100000001;
      uStack_b98 = 0x100000001;
      uStack_b90 = 0x100000001;
      uStack_b88 = 0x100000001;
      local_8c0 = local_1160._0_8_;
      uStack_8b8 = local_1160._8_8_;
      uStack_8b0 = local_1160._16_8_;
      uStack_8a8 = local_1160._24_8_;
      local_8e0 = 0x100000001;
      uStack_8d8 = 0x100000001;
      uStack_8d0 = 0x100000001;
      uStack_8c8 = 0x100000001;
      auVar31._16_8_ = local_1160._16_8_;
      auVar31._0_16_ = local_1160._0_16_;
      auVar31._24_8_ = local_1160._24_8_;
      auVar30._8_8_ = 0x100000001;
      auVar30._0_8_ = 0x100000001;
      auVar30._16_8_ = 0x100000001;
      auVar30._24_8_ = 0x100000001;
      auVar77 = vpaddd_avx2(auVar31,auVar30);
      local_1160._0_8_ = auVar77._0_8_;
      local_760 = local_1160._0_8_;
      local_1160._8_8_ = auVar77._8_8_;
      uStack_758 = local_1160._8_8_;
      local_1160._16_8_ = auVar77._16_8_;
      uStack_750 = local_1160._16_8_;
      local_1160._24_8_ = auVar77._24_8_;
      uStack_748 = local_1160._24_8_;
      local_780 = 0xfffffffefffffffe;
      uStack_778 = 0xfffffffefffffffe;
      uStack_770 = 0xfffffffefffffffe;
      uStack_768 = 0xfffffffefffffffe;
      auVar34._8_8_ = 0xfffffffefffffffe;
      auVar34._0_8_ = 0xfffffffefffffffe;
      auVar34._16_8_ = 0xfffffffefffffffe;
      auVar34._24_8_ = 0xfffffffefffffffe;
      auVar4 = vpand_avx2(auVar77,auVar34);
      local_1160._0_8_ = auVar4._0_8_;
      local_820 = local_1160._0_8_;
      local_1160._8_8_ = auVar4._8_8_;
      uStack_818 = local_1160._8_8_;
      local_1160._16_8_ = auVar4._16_8_;
      uStack_810 = local_1160._16_8_;
      local_1160._24_8_ = auVar4._24_8_;
      uStack_808 = local_1160._24_8_;
      auVar77 = vcvtdq2ps_avx(auVar4);
      local_840 = local_1160._0_8_;
      uStack_838 = local_1160._8_8_;
      uStack_830 = local_1160._16_8_;
      uStack_828 = local_1160._24_8_;
      local_860 = 0x200000002;
      uStack_858 = 0x200000002;
      uStack_850 = 0x200000002;
      uStack_848 = 0x200000002;
      local_7e0 = local_1160._0_8_;
      uStack_7d8 = local_1160._8_8_;
      uStack_7d0 = local_1160._16_8_;
      uStack_7c8 = local_1160._24_8_;
      local_800 = 0x200000002;
      uStack_7f8 = 0x200000002;
      uStack_7f0 = 0x200000002;
      uStack_7e8 = 0x200000002;
      auVar32._8_8_ = 0x200000002;
      auVar32._0_8_ = 0x200000002;
      auVar32._16_8_ = 0x200000002;
      auVar32._24_8_ = 0x200000002;
      auVar5 = vpsubd_avx2(auVar4,auVar32);
      local_1160._0_8_ = auVar5._0_8_;
      local_660 = local_1160._0_8_;
      local_1160._8_8_ = auVar5._8_8_;
      uStack_658 = local_1160._8_8_;
      local_1160._16_8_ = auVar5._16_8_;
      uStack_650 = local_1160._16_8_;
      local_1160._24_8_ = auVar5._24_8_;
      uStack_648 = local_1160._24_8_;
      local_680 = 0x400000004;
      uStack_678 = 0x400000004;
      uStack_670 = 0x400000004;
      uStack_668 = 0x400000004;
      auVar37._8_8_ = 0x400000004;
      auVar37._0_8_ = 0x400000004;
      auVar37._16_8_ = 0x400000004;
      auVar37._24_8_ = 0x400000004;
      auVar4 = vpandn_avx2(auVar5,auVar37);
      local_1140._0_8_ = auVar4._0_8_;
      local_b40 = local_1140._0_8_;
      local_1140._8_8_ = auVar4._8_8_;
      uStack_b38 = local_1140._8_8_;
      local_1140._16_8_ = auVar4._16_8_;
      uStack_b30 = local_1140._16_8_;
      local_1140._24_8_ = auVar4._24_8_;
      uStack_b28 = local_1140._24_8_;
      local_b44 = 0x1d;
      local_880 = local_1140._0_8_;
      uStack_878 = local_1140._8_8_;
      uStack_870 = local_1140._16_8_;
      uStack_868 = local_1140._24_8_;
      local_884 = 0x1d;
      local_1140 = vpslld_avx2(auVar4,ZEXT416(0x1d));
      local_7a0 = local_1160._0_8_;
      uStack_798 = local_1160._8_8_;
      uStack_790 = local_1160._16_8_;
      uStack_788 = local_1160._24_8_;
      local_7c0 = 0x200000002;
      uStack_7b8 = 0x200000002;
      uStack_7b0 = 0x200000002;
      uStack_7a8 = 0x200000002;
      auVar33._8_8_ = 0x200000002;
      auVar33._0_8_ = 0x200000002;
      auVar33._16_8_ = 0x200000002;
      auVar33._24_8_ = 0x200000002;
      auVar4 = vpand_avx2(auVar5,auVar33);
      local_1160._0_8_ = auVar4._0_8_;
      local_720 = local_1160._0_8_;
      local_1160._8_8_ = auVar4._8_8_;
      uStack_718 = local_1160._8_8_;
      local_1160._16_8_ = auVar4._16_8_;
      uStack_710 = local_1160._16_8_;
      local_1160._24_8_ = auVar4._24_8_;
      uStack_708 = local_1160._24_8_;
      local_740 = 0;
      uStack_738 = 0;
      uStack_730 = 0;
      uStack_728 = 0;
      local_1160 = vpcmpeqd_avx2(auVar4,ZEXT1632(ZEXT816(0)));
      local_1060 = local_1140._0_8_;
      uStack_1058 = local_1140._8_8_;
      uStack_1050 = local_1140._16_8_;
      uStack_1048 = local_1140._24_8_;
      local_1180 = local_1140._0_8_;
      uStack_1178 = local_1140._8_8_;
      uStack_1170 = local_1140._16_8_;
      uStack_1168 = local_1140._24_8_;
      local_1080 = local_1160._0_8_;
      uStack_1078 = local_1160._8_8_;
      uStack_1070 = local_1160._16_8_;
      uStack_1068 = local_1160._24_8_;
      local_11a0 = local_1160._0_8_;
      uStack_1198 = local_1160._8_8_;
      uStack_1190 = local_1160._16_8_;
      uStack_1188 = local_1160._24_8_;
      local_10c0 = 0xbf490000;
      uStack_10bc = 0xbf490000;
      uStack_10b8 = 0xbf490000;
      uStack_10b4 = 0xbf490000;
      uStack_10b0 = 0xbf490000;
      uStack_10ac = 0xbf490000;
      uStack_10a8 = 0xbf490000;
      uStack_10a4 = 0xbf490000;
      local_10e0 = 0xb97da000b97da000;
      local_10e0._4_4_ = 0xb97da000;
      uStack_10d8 = 0xb97da000b97da000;
      uStack_10d8._4_4_ = 0xb97da000;
      uStack_10d0 = 0xb97da000b97da000;
      uStack_10d0._4_4_ = 0xb97da000;
      uStack_10c8 = 0xb97da000b97da000;
      uStack_10c8._4_4_ = 0xb97da000;
      local_d80 = local_1120;
      local_d28 = &local_10c0;
      local_d60 = local_10a0;
      local_1120 = auVar77._0_8_;
      local_ae0 = local_1120;
      uStack_1118 = auVar77._8_8_;
      uStack_ad8 = uStack_1118;
      uStack_1110 = auVar77._16_8_;
      uStack_ad0 = uStack_1110;
      uStack_1108 = auVar77._24_8_;
      uStack_ac8 = uStack_1108;
      local_b00 = 0xbf490000bf490000;
      uStack_af8 = 0xbf490000bf490000;
      uStack_af0 = 0xbf490000bf490000;
      uStack_ae8 = 0xbf490000bf490000;
      auVar50._8_4_ = 0xbf490000;
      auVar50._0_8_ = 0xbf490000bf490000;
      auVar50._12_4_ = 0xbf490000;
      auVar50._16_4_ = 0xbf490000;
      auVar50._20_4_ = 0xbf490000;
      auVar50._24_4_ = 0xbf490000;
      auVar50._28_4_ = 0xbf490000;
      local_b20 = local_10a0._0_8_;
      uStack_b18 = local_10a0._8_8_;
      uStack_b10 = local_10a0._16_8_;
      uStack_b08 = local_10a0._24_8_;
      auVar76 = vfmadd213ps_fma(auVar50,auVar77,auVar3);
      local_d40 = &local_10e0;
      local_a80 = local_1120;
      uStack_a78 = uStack_1118;
      uStack_a70 = uStack_1110;
      uStack_a68 = uStack_1108;
      local_aa0 = 0xb97da000b97da000;
      uStack_a98 = 0xb97da000b97da000;
      uStack_a90 = 0xb97da000b97da000;
      uStack_a88 = 0xb97da000b97da000;
      auVar49._8_4_ = 0xb97da000;
      auVar49._0_8_ = 0xb97da000b97da000;
      auVar49._12_4_ = 0xb97da000;
      auVar49._16_4_ = 0xb97da000;
      auVar49._20_4_ = 0xb97da000;
      auVar49._24_4_ = 0xb97da000;
      auVar49._28_4_ = 0xb97da000;
      local_10a0._0_8_ = auVar76._0_8_;
      local_ac0 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar76._8_8_;
      uStack_ab8 = local_10a0._8_8_;
      uStack_ab0 = 0;
      uStack_aa8 = 0;
      auVar76 = vfmadd213ps_fma(auVar49,auVar77,ZEXT1632(auVar76));
      local_d58 = &local_1100;
      local_a20 = local_1120;
      uStack_a18 = uStack_1118;
      uStack_a10 = uStack_1110;
      uStack_a08 = uStack_1108;
      local_a40 = 0xb3222169b3222169;
      uStack_a38 = 0xb3222169b3222169;
      uStack_a30 = 0xb3222169b3222169;
      uStack_a28 = 0xb3222169b3222169;
      auVar48._8_4_ = 0xb3222169;
      auVar48._0_8_ = 0xb3222169b3222169;
      auVar48._12_4_ = 0xb3222169;
      auVar48._16_4_ = 0xb3222169;
      auVar48._20_4_ = 0xb3222169;
      auVar48._24_4_ = 0xb3222169;
      auVar48._28_4_ = 0xb3222169;
      local_10a0._0_8_ = auVar76._0_8_;
      local_a60 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar76._8_8_;
      uStack_a58 = local_10a0._8_8_;
      uStack_a50 = 0;
      uStack_a48 = 0;
      auVar76 = vfmadd213ps_fma(auVar48,auVar77,ZEXT1632(auVar76));
      uStack_1118._0_4_ = 0x37ccf5ce;
      local_1120 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_1118._4_4_ = 0x37ccf5ce;
      uStack_1110._0_4_ = 0x37ccf5ce;
      uStack_1110._4_4_ = 0x37ccf5ce;
      auVar60 = _local_1120;
      uStack_1108._0_4_ = 0x37ccf5ce;
      uStack_1108._4_4_ = 0x37ccf5ce;
      auVar77 = _local_1120;
      local_10a0._0_8_ = auVar76._0_8_;
      local_e20 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar76._8_8_;
      uStack_e18 = local_10a0._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e00._0_4_ = auVar76._0_4_;
      local_e00._4_4_ = auVar76._4_4_;
      uStack_df8._0_4_ = auVar76._8_4_;
      uStack_df8._4_4_ = auVar76._12_4_;
      uStack_11a4 = 0;
      local_11c0 = (float)local_e00 * (float)local_e00;
      fStack_11bc = local_e00._4_4_ * local_e00._4_4_;
      fStack_11b8 = (float)uStack_df8 * (float)uStack_df8;
      fStack_11b4 = uStack_df8._4_4_ * uStack_df8._4_4_;
      uStack_11b0 = 0;
      uStack_11ac = 0;
      uStack_11a8 = 0;
      local_d88 = &local_11c0;
      local_d78 = _ps256_coscof_p1;
      local_9c0 = 0x37ccf5ce37ccf5ce;
      uStack_9b8 = uStack_1118;
      uStack_1110 = auVar60._16_8_;
      uStack_9b0 = uStack_1110;
      uStack_1108 = auVar77._24_8_;
      uStack_9a8 = uStack_1108;
      local_9e0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_9d8 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_9d0 = 0;
      uStack_9c8 = 0;
      local_a00[0] = -0.0013887316;
      local_a00[1] = -0.0013887316;
      afStack_9f8[0] = -0.0013887316;
      afStack_9f8[1] = -0.0013887316;
      afStack_9f0[0] = -0.0013887316;
      afStack_9f0[1] = -0.0013887316;
      afStack_9e8[0] = -0.0013887316;
      afStack_9e8[1] = -0.0013887316;
      auVar4._8_4_ = -0.0013887316;
      auVar4._12_4_ = -0.0013887316;
      auVar4._0_4_ = -0.0013887316;
      auVar4._4_4_ = -0.0013887316;
      auVar4._16_4_ = -0.0013887316;
      auVar4._20_4_ = -0.0013887316;
      auVar4._24_4_ = -0.0013887316;
      auVar4._28_4_ = -0.0013887316;
      auVar7 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11b4,
                                                  CONCAT48(fStack_11b8,
                                                           CONCAT44(fStack_11bc,local_11c0)))),
                               auVar77,auVar4);
      local_d90 = _ps256_coscof_p2;
      local_1120 = auVar7._0_8_;
      local_960 = local_1120;
      uStack_1118 = auVar7._8_8_;
      uStack_958 = uStack_1118;
      uStack_950 = 0;
      uStack_948 = 0;
      local_980 = CONCAT44(fStack_11bc,local_11c0);
      uStack_978 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_970 = 0;
      uStack_968 = 0;
      local_9a0[0] = 0.041666646;
      local_9a0[1] = 0.041666646;
      afStack_998[0] = 0.041666646;
      afStack_998[1] = 0.041666646;
      afStack_990[0] = 0.041666646;
      afStack_990[1] = 0.041666646;
      afStack_988[0] = 0.041666646;
      afStack_988[1] = 0.041666646;
      auVar5._8_4_ = 0.041666646;
      auVar5._12_4_ = 0.041666646;
      auVar5._0_4_ = 0.041666646;
      auVar5._4_4_ = 0.041666646;
      auVar5._16_4_ = 0.041666646;
      auVar5._20_4_ = 0.041666646;
      auVar5._24_4_ = 0.041666646;
      auVar5._28_4_ = 0.041666646;
      auVar7 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11b4,
                                                  CONCAT48(fStack_11b8,
                                                           CONCAT44(fStack_11bc,local_11c0)))),
                               ZEXT1632(auVar7),auVar5);
      local_1120 = auVar7._0_8_;
      uVar14 = local_1120;
      uStack_1118 = auVar7._8_8_;
      uVar15 = uStack_1118;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e60 = CONCAT44(fStack_11bc,local_11c0);
      uStack_e58 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e40._0_4_ = auVar7._0_4_;
      local_e40._4_4_ = auVar7._4_4_;
      uStack_e38._0_4_ = auVar7._8_4_;
      uStack_e38._4_4_ = auVar7._12_4_;
      local_1120._4_4_ = local_e40._4_4_ * fStack_11bc;
      local_1120._0_4_ = (float)local_e40 * local_11c0;
      uStack_1118._0_4_ = (float)uStack_e38 * fStack_11b8;
      uStack_1118._4_4_ = uStack_e38._4_4_ * fStack_11b4;
      local_e80 = local_1120;
      uStack_e78 = uStack_1118;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_e98 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_1120._4_4_ = local_e40._4_4_ * fStack_11bc * fStack_11bc;
      local_1120._0_4_ = (float)local_e40 * local_11c0 * local_11c0;
      local_940 = local_1120;
      uStack_1118._0_4_ = (float)uStack_e38 * fStack_11b8 * fStack_11b8;
      uStack_1118._4_4_ = uStack_e38._4_4_ * fStack_11b4 * fStack_11b4;
      auVar7 = _local_1120;
      _local_1120 = ZEXT1632(_local_1120);
      auVar77 = _local_1120;
      local_d10 = ::_ps256_0p5;
      local_900 = CONCAT44(fStack_11bc,local_11c0);
      uStack_8f8 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_8f0 = 0;
      uStack_8e8 = 0;
      local_920[0] = 0.5;
      local_920[1] = 0.5;
      afStack_918[0] = 0.5;
      afStack_918[1] = 0.5;
      afStack_910[0] = 0.5;
      afStack_910[1] = 0.5;
      afStack_908[0] = 0.5;
      afStack_908[1] = 0.5;
      uStack_1118 = auVar7._8_8_;
      uStack_938 = uStack_1118;
      uStack_930 = 0;
      uStack_928 = 0;
      auVar29._8_4_ = 0.5;
      auVar29._12_4_ = 0.5;
      auVar29._0_4_ = 0.5;
      auVar29._4_4_ = 0.5;
      auVar29._16_4_ = 0.5;
      auVar29._20_4_ = 0.5;
      auVar29._24_4_ = 0.5;
      auVar29._28_4_ = 0.5;
      auVar7 = vfnmadd213ps_fma(auVar29,ZEXT1632(CONCAT412(fStack_11b4,
                                                           CONCAT48(fStack_11b8,
                                                                    CONCAT44(fStack_11bc,local_11c0)
                                                                   ))),auVar77);
      local_1120 = auVar7._0_8_;
      uVar16 = local_1120;
      uStack_1118 = auVar7._8_8_;
      uVar17 = uStack_1118;
      uStack_bd0 = 0;
      uStack_bc8 = 0;
      local_c00 = 0x3f800000;
      uStack_bfc = 0x3f800000;
      uStack_bf8 = 0x3f800000;
      uStack_bf4 = 0x3f800000;
      uStack_bf0 = 0x3f800000;
      uStack_bec = 0x3f800000;
      uStack_be8 = 0x3f800000;
      uStack_be4 = 0x3f800000;
      local_be0._0_4_ = auVar7._0_4_;
      local_be0._4_4_ = auVar7._4_4_;
      uStack_bd8._0_4_ = auVar7._8_4_;
      uStack_bd8._4_4_ = auVar7._12_4_;
      local_1120._4_4_ = local_be0._4_4_ + 1.0;
      local_1120._0_4_ = (float)local_be0 + 1.0;
      uStack_1118._0_4_ = (float)uStack_bd8 + 1.0;
      uStack_1118._4_4_ = uStack_bd8._4_4_ + 1.0;
      uStack_1110._0_4_ = 0x3f800000;
      uStack_1110._4_4_ = 0x3f800000;
      auVar61 = _local_1120;
      uStack_1108._0_4_ = 0x3f800000;
      uStack_1108._4_4_ = 0x3f800000;
      auVar3 = _local_1120;
      uStack_11d8._0_4_ = 0xb94ca1f9;
      local_11e0 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_11d8._4_4_ = 0xb94ca1f9;
      uStack_11d0._0_4_ = 0xb94ca1f9;
      uStack_11d0._4_4_ = 0xb94ca1f9;
      auVar60 = _local_11e0;
      uStack_11c8._0_4_ = 0xb94ca1f9;
      uStack_11c8._4_4_ = 0xb94ca1f9;
      auVar77 = _local_11e0;
      local_ec0 = 0xb94ca1f9b94ca1f9;
      uStack_eb8 = uStack_11d8;
      uStack_11d0 = auVar60._16_8_;
      uStack_eb0 = uStack_11d0;
      uStack_11c8 = auVar77._24_8_;
      uStack_ea8 = uStack_11c8;
      local_ee0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_ed8 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_11e0._4_4_ = fStack_11bc * -0.00019515296;
      local_11e0._0_4_ = local_11c0 * -0.00019515296;
      uStack_11d8._0_4_ = fStack_11b8 * -0.00019515296;
      uStack_11d8._4_4_ = fStack_11b4 * -0.00019515296;
      uStack_11d0._0_4_ = 0x80000000;
      uStack_11d0._4_4_ = 0x80000000;
      auVar60 = _local_11e0;
      uStack_11c8._0_4_ = 0x80000000;
      uStack_11c8._4_4_ = 0xb94ca1f9;
      auVar77 = _local_11e0;
      local_c20 = local_11e0;
      uStack_c18 = uStack_11d8;
      uStack_11d0 = auVar60._16_8_;
      uStack_c10 = uStack_11d0;
      uStack_11c8 = auVar77._24_8_;
      uStack_c08 = uStack_11c8;
      local_c40 = 0x3c08839e;
      uStack_c3c = 0x3c08839e;
      uStack_c38 = 0x3c08839e;
      uStack_c34 = 0x3c08839e;
      uStack_c30 = 0x3c08839e;
      uStack_c2c = 0x3c08839e;
      uStack_c28 = 0x3c08839e;
      uStack_c24 = 0x3c08839e;
      local_11e0._0_4_ = local_11c0 * -0.00019515296 + 0.008332161;
      local_11e0._4_4_ = fStack_11bc * -0.00019515296 + 0.008332161;
      fVar85 = fStack_11b8 * -0.00019515296 + 0.008332161;
      fVar86 = fStack_11b4 * -0.00019515296 + 0.008332161;
      uStack_11d8._0_4_ = fVar85;
      uStack_11d8._4_4_ = fVar86;
      uStack_11d0._0_4_ = 0x3c08839e;
      uStack_11d0._4_4_ = 0x3c08839e;
      auVar60 = _local_11e0;
      uStack_11c8._0_4_ = 0x3c08839e;
      uStack_11c8._4_4_ = 0x3c055116;
      auVar77 = _local_11e0;
      local_f00 = local_11e0;
      uStack_ef8 = uStack_11d8;
      uStack_11d0 = auVar60._16_8_;
      uStack_ef0 = uStack_11d0;
      uStack_11c8 = auVar77._24_8_;
      uStack_ee8 = uStack_11c8;
      local_f20 = CONCAT44(fStack_11bc,local_11c0);
      uStack_f18 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_f10 = 0;
      uStack_f08 = 0;
      fVar83 = (float)local_11e0._0_4_ * local_11c0;
      fVar84 = (float)local_11e0._4_4_ * fStack_11bc;
      fVar85 = fVar85 * fStack_11b8;
      fVar86 = fVar86 * fStack_11b4;
      local_11e0._4_4_ = fVar84;
      local_11e0._0_4_ = fVar83;
      local_c60 = local_11e0;
      uStack_11d8._0_4_ = fVar85;
      uStack_11d8._4_4_ = fVar86;
      auVar7 = _local_11e0;
      _local_11e0 = ZEXT1628(_local_11e0);
      uStack_11c8._4_4_ = 0x3c055116;
      auVar77 = _local_11e0;
      uStack_11d8 = auVar7._8_8_;
      uStack_c58 = uStack_11d8;
      uStack_c50 = 0;
      uStack_11c8 = auVar77._24_8_;
      uStack_c48 = uStack_11c8;
      local_c80 = 0xbe2aaaa3;
      uStack_c7c = 0xbe2aaaa3;
      uStack_c78 = 0xbe2aaaa3;
      uStack_c74 = 0xbe2aaaa3;
      uStack_c70 = 0xbe2aaaa3;
      uStack_c6c = 0xbe2aaaa3;
      uStack_c68 = 0xbe2aaaa3;
      uStack_c64 = 0xbe2aaaa3;
      local_11e0._0_4_ = fVar83 + -0.16666655;
      local_11e0._4_4_ = fVar84 + -0.16666655;
      fVar85 = fVar85 + -0.16666655;
      fVar86 = fVar86 + -0.16666655;
      uStack_11d8._0_4_ = fVar85;
      uStack_11d8._4_4_ = fVar86;
      uStack_11d0._0_4_ = 0xbe2aaaa3;
      uStack_11d0._4_4_ = 0xbe2aaaa3;
      auVar60 = _local_11e0;
      uStack_11c8._0_4_ = 0xbe2aaaa3;
      uStack_11c8._4_4_ = 0xbe225592;
      auVar77 = _local_11e0;
      local_f40 = local_11e0;
      uStack_f38 = uStack_11d8;
      uStack_11d0 = auVar60._16_8_;
      uStack_f30 = uStack_11d0;
      uStack_11c8 = auVar77._24_8_;
      uStack_f28 = uStack_11c8;
      local_f60 = CONCAT44(fStack_11bc,local_11c0);
      uStack_f58 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_f50 = 0;
      uStack_f48 = 0;
      local_11e0._0_4_ = (float)local_11e0._0_4_ * local_11c0;
      local_11e0._4_4_ = (float)local_11e0._4_4_ * fStack_11bc;
      fVar85 = fVar85 * fStack_11b8;
      fVar86 = fVar86 * fStack_11b4;
      uStack_11d8._0_4_ = fVar85;
      uStack_11d8._4_4_ = fVar86;
      uStack_11d0._0_4_ = 0x80000000;
      uStack_11d0._4_4_ = 0x80000000;
      auVar60 = _local_11e0;
      uStack_11c8._0_4_ = 0x80000000;
      uStack_11c8._4_4_ = 0xbe225592;
      auVar77 = _local_11e0;
      local_f80 = local_11e0;
      uStack_f78 = uStack_11d8;
      uStack_11d0 = auVar60._16_8_;
      uStack_f70 = uStack_11d0;
      uStack_11c8 = auVar77._24_8_;
      uStack_f68 = uStack_11c8;
      local_fa0 = local_10a0._0_8_;
      uStack_f98 = local_10a0._8_8_;
      uStack_f90 = 0;
      uStack_f88 = 0;
      local_11e0._0_4_ = (float)local_11e0._0_4_ * (float)local_e00;
      local_11e0._4_4_ = (float)local_11e0._4_4_ * local_e00._4_4_;
      fVar85 = fVar85 * (float)uStack_df8;
      fVar86 = fVar86 * uStack_df8._4_4_;
      uStack_11d8._0_4_ = fVar85;
      uStack_11d8._4_4_ = fVar86;
      uStack_11d0._0_4_ = 0x80000000;
      uStack_11d0._4_4_ = 0x80000000;
      auVar60 = _local_11e0;
      uStack_11c8._0_4_ = 0x80000000;
      uStack_11c8._4_4_ = 0xbe225592;
      auVar77 = _local_11e0;
      local_ca0 = local_11e0;
      uStack_c98 = uStack_11d8;
      uStack_11d0 = auVar60._16_8_;
      uStack_c90 = uStack_11d0;
      uStack_11c8 = auVar77._24_8_;
      uStack_c88 = uStack_11c8;
      local_cc0 = local_10a0._0_8_;
      uStack_cb8 = local_10a0._8_8_;
      uStack_cb0 = 0;
      uStack_ca8 = 0;
      local_11e0._4_4_ = (float)local_11e0._4_4_ + local_e00._4_4_;
      local_11e0._0_4_ = (float)local_11e0._0_4_ + (float)local_e00;
      local_1040 = local_11e0;
      uStack_11d8._0_4_ = fVar85 + (float)uStack_df8;
      uStack_11d8._4_4_ = fVar86 + uStack_df8._4_4_;
      auVar7 = _local_11e0;
      _local_11e0 = ZEXT1628(_local_11e0);
      uStack_11c8._4_4_ = 0xbe225592;
      auVar77 = _local_11e0;
      local_1100._4_4_ = local_1160._4_4_;
      uStack_10f8._4_4_ = local_1160._12_4_;
      uStack_10f0._4_4_ = local_1160._20_4_;
      uStack_10e8._4_4_ = local_1160._28_4_;
      local_1020 = local_1160._0_8_;
      uStack_1018 = local_1160._8_8_;
      uStack_1010 = local_1160._16_8_;
      uStack_1008 = local_1160._24_8_;
      uStack_11d8 = auVar7._8_8_;
      uStack_1038 = uStack_11d8;
      uStack_1030 = 0;
      uStack_11c8 = auVar77._24_8_;
      uStack_1028 = uStack_11c8;
      auVar77._16_8_ = 0;
      auVar77._0_16_ = auVar7;
      auVar77._24_8_ = uStack_11c8;
      _local_11e0 = vpand_avx2(local_1160,auVar77);
      local_6a0 = local_1160._0_8_;
      uStack_698 = local_1160._8_8_;
      uStack_690 = local_1160._16_8_;
      uStack_688 = local_1160._24_8_;
      local_6c0 = local_1120;
      uStack_6b8 = uStack_1118;
      uStack_1110 = auVar61._16_8_;
      uStack_6b0 = uStack_1110;
      uStack_1108 = auVar3._24_8_;
      uStack_6a8 = uStack_1108;
      auVar77 = vpternlogq_avx512vl(local_1160,local_1160,local_1160,0xf);
      auVar36._16_8_ = uStack_1110;
      auVar36._0_16_ = _local_1120;
      auVar36._24_8_ = uStack_1108;
      auVar77 = vpand_avx2(auVar77,auVar36);
      local_1120 = auVar77._0_8_;
      uVar18 = local_1120;
      uStack_1118 = auVar77._8_8_;
      uVar19 = uStack_1118;
      uStack_1110 = auVar77._16_8_;
      uVar20 = uStack_1110;
      uStack_1108 = auVar77._24_8_;
      uVar21 = uStack_1108;
      local_ce0._0_4_ = auVar77._0_4_;
      local_ce0._4_4_ = auVar77._4_4_;
      uStack_cd8._0_4_ = auVar77._8_4_;
      uStack_cd8._4_4_ = auVar77._12_4_;
      uStack_cd0._0_4_ = auVar77._16_4_;
      uStack_cd0._4_4_ = auVar77._20_4_;
      uStack_cc8._0_4_ = auVar77._24_4_;
      uStack_cc8._4_4_ = auVar77._28_4_;
      local_d00._0_4_ = local_11e0._0_4_;
      local_d00._4_4_ = local_11e0._4_4_;
      uStack_cf8._0_4_ = local_11e0._8_4_;
      uStack_cf8._4_4_ = local_11e0._12_4_;
      uStack_cf0._0_4_ = local_11e0._16_4_;
      uStack_cf0._4_4_ = local_11e0._20_4_;
      uStack_ce8._0_4_ = local_11e0._24_4_;
      uStack_ce8._4_4_ = local_11e0._28_4_;
      local_1120._4_4_ = local_ce0._4_4_ + local_d00._4_4_;
      local_1120._0_4_ = (float)local_ce0 + (float)local_d00;
      uStack_1118._0_4_ = (float)uStack_cd8 + (float)uStack_cf8;
      uStack_1118._4_4_ = uStack_cd8._4_4_ + uStack_cf8._4_4_;
      uStack_1110._0_4_ = (float)uStack_cd0 + (float)uStack_cf0;
      uStack_1110._4_4_ = uStack_cd0._4_4_ + uStack_cf0._4_4_;
      auVar60 = _local_1120;
      uStack_1108._0_4_ = (float)uStack_cc8 + (float)uStack_ce8;
      uStack_1108._4_4_ = uStack_cc8._4_4_ + uStack_ce8._4_4_;
      auVar77 = _local_1120;
      local_6e0 = local_1120;
      uStack_6d8 = uStack_1118;
      uStack_1110 = auVar60._16_8_;
      uStack_6d0 = uStack_1110;
      uStack_1108 = auVar77._24_8_;
      uStack_6c8 = uStack_1108;
      local_700 = local_1140._0_8_;
      uStack_6f8 = local_1140._8_8_;
      uStack_6f0 = local_1140._16_8_;
      uStack_6e8 = local_1140._24_8_;
      auVar35._16_8_ = uStack_1110;
      auVar35._0_16_ = _local_1120;
      auVar35._24_8_ = uStack_1108;
      _local_1120 = auVar35 ^ local_1140;
      local_29e0 = local_1120;
      uStack_29d8 = uStack_1118;
      uStack_29d0 = uStack_1110;
      uStack_29c8 = uStack_1108;
      local_2820 = local_2930;
      local_2840 = local_1120;
      uStack_2838 = uStack_1118;
      uStack_2830 = uStack_1110;
      uStack_2828 = uStack_1108;
      *(undefined1 (*) [32])*local_2930 = _local_1120;
      local_2930 = (undefined1 (*) [64])(*local_2930 + 0x20);
      uVar62 = local_1160._0_8_;
      uVar63 = local_1160._8_8_;
      uVar8 = local_1160._16_8_;
      uVar9 = local_1160._24_8_;
      local_10a0 = ZEXT1632(auVar76);
      local_e40 = uVar14;
      uStack_e38 = uVar15;
      local_e00 = local_e20;
      uStack_df8 = uStack_e18;
      uStack_df0 = uStack_e10;
      uStack_de8 = uStack_e08;
      local_dc0 = uVar10;
      uStack_db8 = uVar11;
      uStack_db0 = uVar12;
      uStack_da8 = uVar13;
      local_d70 = local_d88;
      local_d68 = local_d80;
      local_d50 = local_d80;
      local_d48 = local_d60;
      local_d38 = local_d80;
      local_d30 = local_d60;
      local_d20 = local_d80;
      local_d18 = local_d80;
      local_d08 = local_d88;
      local_d00 = local_11e0;
      uStack_cf8 = uStack_11d8;
      uStack_cf0 = uStack_11d0;
      uStack_ce8 = uStack_11c8;
      local_ce0 = uVar18;
      uStack_cd8 = uVar19;
      uStack_cd0 = uVar20;
      uStack_cc8 = uVar21;
      local_be0 = uVar16;
      uStack_bd8 = uVar17;
    }
    for (; uStack_5b8 = uVar63, local_5c0 = uVar62, uVar73 = uStack_5b8._4_4_,
        uVar72 = local_5c0._4_4_, local_27a8 = local_28d0, local_2958 = local_27f8,
        uVar68 = local_10e0._4_4_, uVar69 = uStack_10d8._4_4_, uVar70 = uStack_10d0._4_4_,
        uVar71 = uStack_10c8._4_4_, uVar74 = local_5b0._4_4_, uVar75 = uStack_5a8._4_4_,
        local_297c + 3 < local_2924; local_297c = local_297c + 4) {
      local_2818 = local_2930;
      local_530 = *(undefined8 *)*local_2930;
      uStack_528 = *(undefined8 *)(*local_2930 + 8);
      local_2758 = local_2909;
      local_2760 = &local_29f0;
      local_520 = (undefined1  [16])0x0;
      local_540 = 0x7fffffff;
      uStack_53c = 0x7fffffff;
      uStack_538 = 0x7fffffff;
      uStack_534 = 0x7fffffff;
      auVar76._8_4_ = 0x7fffffff;
      auVar76._0_8_ = 0x7fffffff7fffffff;
      auVar76._12_4_ = 0x7fffffff;
      auVar7 = vpand_avx(*(undefined1 (*) [16])*local_2930,auVar76);
      local_590._0_8_ = auVar7._0_8_;
      uVar8 = local_590._0_8_;
      local_590._8_8_ = auVar7._8_8_;
      uVar9 = local_590._8_8_;
      local_490 = 0x3fa2f983;
      uStack_48c = 0x3fa2f983;
      uStack_488 = 0x3fa2f983;
      uStack_484 = 0x3fa2f983;
      local_480._0_4_ = auVar7._0_4_;
      local_480._4_4_ = auVar7._4_4_;
      uStack_478._0_4_ = auVar7._8_4_;
      uStack_478._4_4_ = auVar7._12_4_;
      local_5d0._4_4_ = local_480._4_4_ * 1.2732395;
      local_5d0._0_4_ = (float)local_480 * 1.2732395;
      uStack_5c8._0_4_ = (float)uStack_478 * 1.2732395;
      uStack_5c8._4_4_ = uStack_478._4_4_ * 1.2732395;
      local_430 = local_5d0;
      uStack_428 = uStack_5c8;
      local_5f0._4_4_ = (int)(local_480._4_4_ * 1.2732395);
      local_5f0._0_4_ = (int)((float)local_480 * 1.2732395);
      local_5f0._8_4_ = (int)((float)uStack_478 * 1.2732395);
      local_5f0._12_4_ = (int)(uStack_478._4_4_ * 1.2732395);
      local_320 = local_5f0._0_8_;
      uStack_318 = local_5f0._8_8_;
      local_330 = 0x100000001;
      uStack_328 = 0x100000001;
      auVar2._8_8_ = local_5f0._8_8_;
      auVar2._0_8_ = local_5f0._0_8_;
      auVar1._8_8_ = 0x100000001;
      auVar1._0_8_ = 0x100000001;
      auVar76 = vpaddd_avx(auVar2,auVar1);
      local_5f0._0_8_ = auVar76._0_8_;
      local_f0 = local_5f0._0_8_;
      local_5f0._8_8_ = auVar76._8_8_;
      uStack_e8 = local_5f0._8_8_;
      local_100 = 0xfffffffefffffffe;
      uStack_f8 = 0xfffffffefffffffe;
      auVar44._8_8_ = 0xfffffffefffffffe;
      auVar44._0_8_ = 0xfffffffefffffffe;
      auVar1 = vpand_avx(auVar76,auVar44);
      local_5f0._0_8_ = auVar1._0_8_;
      local_420 = local_5f0._0_8_;
      local_5f0._8_8_ = auVar1._8_8_;
      uStack_418 = local_5f0._8_8_;
      auVar76 = vcvtdq2ps_avx(auVar1);
      local_130 = local_5f0._0_8_;
      uStack_128 = local_5f0._8_8_;
      local_140 = 0x200000002;
      uStack_138 = 0x200000002;
      auVar42._8_8_ = 0x200000002;
      auVar42._0_8_ = 0x200000002;
      auVar2 = vpsubd_avx(auVar1,auVar42);
      local_5f0._0_8_ = auVar2._0_8_;
      local_60 = local_5f0._0_8_;
      local_5f0._8_8_ = auVar2._8_8_;
      uStack_58 = local_5f0._8_8_;
      local_70 = 0x400000004;
      uStack_68 = 0x400000004;
      auVar47._8_8_ = 0x400000004;
      auVar47._0_8_ = 0x400000004;
      auVar1 = vpandn_avx(auVar2,auVar47);
      local_5e0._0_8_ = auVar1._0_8_;
      local_300 = local_5e0._0_8_;
      local_5e0._8_8_ = auVar1._8_8_;
      uStack_2f8 = local_5e0._8_8_;
      local_304 = 0x1d;
      local_5e0 = vpslld_avx(auVar1,ZEXT416(0x1d));
      local_110 = local_5f0._0_8_;
      uStack_108 = local_5f0._8_8_;
      local_120 = 0x200000002;
      uStack_118 = 0x200000002;
      auVar43._8_8_ = 0x200000002;
      auVar43._0_8_ = 0x200000002;
      auVar1 = vpand_avx(auVar2,auVar43);
      local_5f0._0_8_ = auVar1._0_8_;
      local_d0 = local_5f0._0_8_;
      local_5f0._8_8_ = auVar1._8_8_;
      uStack_c8 = local_5f0._8_8_;
      local_c0 = (undefined1  [16])0x0;
      local_e0 = 0;
      uStack_d8 = 0;
      local_5f0 = vpcmpeqd_avx(auVar1,ZEXT816(0));
      local_570 = local_5e0._0_8_;
      uStack_568 = local_5e0._8_8_;
      local_600 = local_5e0._0_8_;
      uStack_5f8 = local_5e0._8_8_;
      local_580 = local_5f0._0_8_;
      uStack_578 = local_5f0._8_8_;
      local_610 = local_5f0._0_8_;
      uStack_608 = local_5f0._8_8_;
      local_5a0 = 0xbf490000;
      uStack_59c = 0xbf490000;
      uStack_598 = 0xbf490000;
      uStack_594 = 0xbf490000;
      local_5b0 = 0xb97da000b97da000;
      local_5b0._4_4_ = 0xb97da000;
      uStack_5a8 = 0xb97da000b97da000;
      uStack_5a8._4_4_ = 0xb97da000;
      local_408 = local_5d0;
      local_340 = &local_5a0;
      local_3f0 = local_590;
      local_5d0 = auVar76._0_8_;
      local_2a0 = local_5d0;
      uStack_5c8 = auVar76._8_8_;
      uStack_298 = uStack_5c8;
      local_2b0 = 0xbf490000bf490000;
      uStack_2a8 = 0xbf490000bf490000;
      auVar58._8_4_ = 0xbf490000;
      auVar58._0_8_ = 0xbf490000bf490000;
      auVar58._12_4_ = 0xbf490000;
      local_2c0 = local_590._0_8_;
      uStack_2b8 = local_590._8_8_;
      auVar7 = vfmadd213ps_fma(auVar58,auVar76,auVar7);
      local_358 = &local_5b0;
      local_270 = local_5d0;
      uStack_268 = uStack_5c8;
      local_280 = 0xb97da000b97da000;
      uStack_278 = 0xb97da000b97da000;
      auVar57._8_4_ = 0xb97da000;
      auVar57._0_8_ = 0xb97da000b97da000;
      auVar57._12_4_ = 0xb97da000;
      local_590._0_8_ = auVar7._0_8_;
      local_290 = local_590._0_8_;
      local_590._8_8_ = auVar7._8_8_;
      uStack_288 = local_590._8_8_;
      auVar7 = vfmadd213ps_fma(auVar57,auVar76,auVar7);
      local_370 = &local_5c0;
      local_240 = local_5d0;
      uStack_238 = uStack_5c8;
      local_250 = 0xb3222169b3222169;
      uStack_248 = 0xb3222169b3222169;
      auVar56._8_4_ = 0xb3222169;
      auVar56._0_8_ = 0xb3222169b3222169;
      auVar56._12_4_ = 0xb3222169;
      local_590._0_8_ = auVar7._0_8_;
      local_260 = local_590._0_8_;
      local_590._8_8_ = auVar7._8_8_;
      uStack_258 = local_590._8_8_;
      local_590 = vfmadd213ps_fma(auVar56,auVar76,auVar7);
      uStack_5c8._0_4_ = 0x37ccf5ce;
      local_5d0 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_5c8._4_4_ = 0x37ccf5ce;
      local_4b0 = local_590._0_8_;
      uStack_4a8 = local_590._8_8_;
      local_4a0._0_4_ = local_590._0_4_;
      local_4a0._4_4_ = local_590._4_4_;
      uStack_498._0_4_ = local_590._8_4_;
      uStack_498._4_4_ = local_590._12_4_;
      local_620 = (float)local_4a0 * (float)local_4a0;
      fStack_61c = local_4a0._4_4_ * local_4a0._4_4_;
      fStack_618 = (float)uStack_498 * (float)uStack_498;
      fStack_614 = uStack_498._4_4_ * uStack_498._4_4_;
      local_3f8 = &local_620;
      local_390 = _ps_coscof_p1;
      local_210 = 0x37ccf5ce37ccf5ce;
      uStack_208 = uStack_5c8;
      local_220 = CONCAT44(fStack_61c,local_620);
      uStack_218 = CONCAT44(fStack_614,fStack_618);
      auVar51._4_4_ = fStack_61c;
      auVar51._0_4_ = local_620;
      auVar51._8_4_ = fStack_618;
      auVar51._12_4_ = fStack_614;
      local_230[0] = -0.0013887316;
      local_230[1] = -0.0013887316;
      afStack_228[0] = -0.0013887316;
      afStack_228[1] = -0.0013887316;
      auVar38._8_4_ = -0.0013887316;
      auVar38._12_4_ = -0.0013887316;
      auVar38._0_4_ = -0.0013887316;
      auVar38._4_4_ = -0.0013887316;
      auVar76 = vfmadd213ps_fma(auVar51,_local_5d0,auVar38);
      local_3a8 = _ps_coscof_p2;
      local_5d0 = auVar76._0_8_;
      local_1e0 = local_5d0;
      uStack_5c8 = auVar76._8_8_;
      uStack_1d8 = uStack_5c8;
      local_1f0 = CONCAT44(fStack_61c,local_620);
      uStack_1e8 = CONCAT44(fStack_614,fStack_618);
      auVar52._4_4_ = fStack_61c;
      auVar52._0_4_ = local_620;
      auVar52._8_4_ = fStack_618;
      auVar52._12_4_ = fStack_614;
      local_200[0] = 0.041666646;
      local_200[1] = 0.041666646;
      afStack_1f8[0] = 0.041666646;
      afStack_1f8[1] = 0.041666646;
      auVar39._8_4_ = 0.041666646;
      auVar39._12_4_ = 0.041666646;
      auVar39._0_4_ = 0.041666646;
      auVar39._4_4_ = 0.041666646;
      auVar76 = vfmadd213ps_fma(auVar52,auVar76,auVar39);
      local_5d0 = auVar76._0_8_;
      uVar10 = local_5d0;
      uStack_5c8 = auVar76._8_8_;
      uVar11 = uStack_5c8;
      local_4d0 = CONCAT44(fStack_61c,local_620);
      uStack_4c8 = CONCAT44(fStack_614,fStack_618);
      local_4c0._0_4_ = auVar76._0_4_;
      local_4c0._4_4_ = auVar76._4_4_;
      uStack_4b8._0_4_ = auVar76._8_4_;
      uStack_4b8._4_4_ = auVar76._12_4_;
      local_5d0._4_4_ = local_4c0._4_4_ * fStack_61c;
      local_5d0._0_4_ = (float)local_4c0 * local_620;
      uStack_5c8._0_4_ = (float)uStack_4b8 * fStack_618;
      uStack_5c8._4_4_ = uStack_4b8._4_4_ * fStack_614;
      local_4e0 = local_5d0;
      uStack_4d8 = uStack_5c8;
      local_4f0 = CONCAT44(fStack_61c,local_620);
      uStack_4e8 = CONCAT44(fStack_614,fStack_618);
      local_5d0._4_4_ = local_4c0._4_4_ * fStack_61c * fStack_61c;
      local_5d0._0_4_ = (float)local_4c0 * local_620 * local_620;
      uStack_5c8._0_4_ = (float)uStack_4b8 * fStack_618 * fStack_618;
      uStack_5c8._4_4_ = uStack_4b8._4_4_ * fStack_614 * fStack_614;
      local_400 = ::_ps_0p5;
      local_2d0 = CONCAT44(fStack_61c,local_620);
      uStack_2c8 = CONCAT44(fStack_614,fStack_618);
      auVar53._4_4_ = fStack_61c;
      auVar53._0_4_ = local_620;
      auVar53._8_4_ = fStack_618;
      auVar53._12_4_ = fStack_614;
      local_2e0[0] = 0.5;
      local_2e0[1] = 0.5;
      afStack_2d8[0] = 0.5;
      afStack_2d8[1] = 0.5;
      local_2f0 = local_5d0;
      uStack_2e8 = uStack_5c8;
      auVar7._8_4_ = 0.5;
      auVar7._12_4_ = 0.5;
      auVar7._0_4_ = 0.5;
      auVar7._4_4_ = 0.5;
      auVar76 = vfnmadd213ps_fma(auVar7,auVar53,_local_5d0);
      local_5d0 = auVar76._0_8_;
      uVar12 = local_5d0;
      uStack_5c8 = auVar76._8_8_;
      uVar13 = uStack_5c8;
      local_450 = 0x3f800000;
      uStack_44c = 0x3f800000;
      uStack_448 = 0x3f800000;
      uStack_444 = 0x3f800000;
      local_440._0_4_ = auVar76._0_4_;
      local_440._4_4_ = auVar76._4_4_;
      uStack_438._0_4_ = auVar76._8_4_;
      uStack_438._4_4_ = auVar76._12_4_;
      local_5d0._4_4_ = local_440._4_4_ + 1.0;
      local_5d0._0_4_ = (float)local_440 + 1.0;
      uStack_5c8._0_4_ = (float)uStack_438 + 1.0;
      uStack_5c8._4_4_ = uStack_438._4_4_ + 1.0;
      uStack_628._0_4_ = 0xb94ca1f9;
      local_630 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_628._4_4_ = 0xb94ca1f9;
      local_3e0 = local_630;
      local_3c0 = _ps_sincof_p1;
      local_1b0 = 0xb94ca1f9b94ca1f9;
      uStack_1a8 = uStack_628;
      local_1c0 = CONCAT44(fStack_61c,local_620);
      uStack_1b8 = CONCAT44(fStack_614,fStack_618);
      auVar54._4_4_ = fStack_61c;
      auVar54._0_4_ = local_620;
      auVar54._8_4_ = fStack_618;
      auVar54._12_4_ = fStack_614;
      local_1d0[0] = 0.008332161;
      local_1d0[1] = 0.008332161;
      afStack_1c8[0] = 0.008332161;
      afStack_1c8[1] = 0.008332161;
      auVar40._8_4_ = 0.008332161;
      auVar40._12_4_ = 0.008332161;
      auVar40._0_4_ = 0.008332161;
      auVar40._4_4_ = 0.008332161;
      auVar76 = vfmadd213ps_fma(auVar54,_local_630,auVar40);
      local_3d8 = _ps_sincof_p2;
      local_630 = auVar76._0_8_;
      local_180 = local_630;
      uStack_628 = auVar76._8_8_;
      uStack_178 = uStack_628;
      local_190 = CONCAT44(fStack_61c,local_620);
      uStack_188 = CONCAT44(fStack_614,fStack_618);
      auVar55._4_4_ = fStack_61c;
      auVar55._0_4_ = local_620;
      auVar55._8_4_ = fStack_618;
      auVar55._12_4_ = fStack_614;
      local_1a0[0] = -0.16666655;
      local_1a0[1] = -0.16666655;
      afStack_198[0] = -0.16666655;
      afStack_198[1] = -0.16666655;
      auVar41._8_4_ = -0.16666655;
      auVar41._12_4_ = -0.16666655;
      auVar41._0_4_ = -0.16666655;
      auVar41._4_4_ = -0.16666655;
      auVar76 = vfmadd213ps_fma(auVar55,auVar76,auVar41);
      local_630 = auVar76._0_8_;
      uVar14 = local_630;
      uStack_628 = auVar76._8_8_;
      uVar15 = uStack_628;
      local_510 = CONCAT44(fStack_61c,local_620);
      uStack_508 = CONCAT44(fStack_614,fStack_618);
      local_500._0_4_ = auVar76._0_4_;
      local_500._4_4_ = auVar76._4_4_;
      uStack_4f8._0_4_ = auVar76._8_4_;
      uStack_4f8._4_4_ = auVar76._12_4_;
      local_630._4_4_ = local_500._4_4_ * fStack_61c;
      local_630._0_4_ = (float)local_500 * local_620;
      uStack_628._0_4_ = (float)uStack_4f8 * fStack_618;
      uStack_628._4_4_ = uStack_4f8._4_4_ * fStack_614;
      local_150 = local_630;
      uStack_148 = uStack_628;
      local_160 = local_590._0_8_;
      uStack_158 = local_590._8_8_;
      local_170 = local_590._0_8_;
      uStack_168 = local_590._8_8_;
      auVar76 = vfmadd213ps_fma(local_590,_local_630,local_590);
      local_5c0._4_4_ = local_5f0._4_4_;
      uStack_5b8._4_4_ = local_5f0._12_4_;
      local_550 = local_5f0._0_8_;
      uStack_548 = local_5f0._8_8_;
      local_630 = auVar76._0_8_;
      local_560 = local_630;
      uStack_628 = auVar76._8_8_;
      uStack_558 = uStack_628;
      _local_630 = vpand_avx(local_5f0,auVar76);
      local_80 = local_5f0._0_8_;
      uStack_78 = local_5f0._8_8_;
      local_90 = local_5d0;
      uStack_88 = uStack_5c8;
      auVar76 = vpternlogq_avx512vl(local_5f0,local_5f0,local_5f0,0xf);
      auVar46._8_8_ = uStack_5c8;
      auVar46._0_8_ = local_5d0;
      auVar76 = vpand_avx(auVar76,auVar46);
      local_5d0 = auVar76._0_8_;
      uVar16 = local_5d0;
      uStack_5c8 = auVar76._8_8_;
      uVar17 = uStack_5c8;
      local_460._0_4_ = auVar76._0_4_;
      local_460._4_4_ = auVar76._4_4_;
      uStack_458._0_4_ = auVar76._8_4_;
      uStack_458._4_4_ = auVar76._12_4_;
      local_470._0_4_ = local_630._0_4_;
      local_470._4_4_ = local_630._4_4_;
      uStack_468._0_4_ = local_630._8_4_;
      uStack_468._4_4_ = local_630._12_4_;
      local_5d0._4_4_ = local_460._4_4_ + local_470._4_4_;
      local_5d0._0_4_ = (float)local_460 + (float)local_470;
      uStack_5c8._0_4_ = (float)uStack_458 + (float)uStack_468;
      uStack_5c8._4_4_ = uStack_458._4_4_ + uStack_468._4_4_;
      local_a0 = local_5d0;
      uStack_98 = uStack_5c8;
      local_b0 = local_5e0._0_8_;
      uStack_a8 = local_5e0._8_8_;
      auVar45._8_8_ = uStack_5c8;
      auVar45._0_8_ = local_5d0;
      _local_5d0 = auVar45 ^ local_5e0;
      local_29f0 = local_5d0;
      uStack_29e8 = uStack_5c8;
      local_2800 = local_2930;
      local_2810 = local_5d0;
      uStack_2808 = uStack_5c8;
      *(undefined1 (*) [16])*local_2930 = _local_5d0;
      local_2930 = (undefined1 (*) [64])(*local_2930 + 0x10);
      uVar62 = local_5f0._0_8_;
      uVar63 = local_5f0._8_8_;
      local_500 = uVar14;
      uStack_4f8 = uVar15;
      local_4c0 = uVar10;
      uStack_4b8 = uVar11;
      local_4a0 = local_4b0;
      uStack_498 = uStack_4a8;
      local_480 = uVar8;
      uStack_478 = uVar9;
      local_470 = local_630;
      uStack_468 = uStack_628;
      local_460 = uVar16;
      uStack_458 = uVar17;
      local_440 = uVar12;
      uStack_438 = uVar13;
      local_3e8 = local_3f0;
      local_3d0 = local_3f8;
      local_3c8 = local_3e0;
      local_3b8 = local_3f8;
      local_3b0 = local_3e0;
      local_3a0 = local_3f8;
      local_398 = local_408;
      local_388 = local_3f8;
      local_380 = local_408;
      local_378 = local_3f0;
      local_368 = local_408;
      local_360 = local_3f0;
      local_350 = local_408;
      local_348 = local_3f0;
      local_338 = local_408;
    }
    for (; uStack_5a8._4_4_ = uVar75, local_5b0._4_4_ = uVar74, uStack_5b8._4_4_ = uVar73,
        local_5c0._4_4_ = uVar72, uStack_10c8._4_4_ = uVar71, uStack_10d0._4_4_ = uVar70,
        uStack_10d8._4_4_ = uVar69, local_10e0._4_4_ = uVar68, uStack_10e8._4_4_ = uVar67,
        uStack_10f0._4_4_ = uVar66, uStack_10f8._4_4_ = uVar65, local_1100._4_4_ = uVar64,
        uVar75 = uStack_5a8._4_4_, uVar74 = local_5b0._4_4_, uVar73 = uStack_5b8._4_4_,
        uVar72 = local_5c0._4_4_, uVar71 = uStack_10c8._4_4_, uVar70 = uStack_10d0._4_4_,
        uVar69 = uStack_10d8._4_4_, uVar68 = local_10e0._4_4_, uVar67 = uStack_10e8._4_4_,
        uVar66 = uStack_10f0._4_4_, uVar65 = uStack_10f8._4_4_, uVar64 = local_1100._4_4_,
        local_297c < local_2924; local_297c = local_297c + 1) {
      local_2748 = local_2909;
      local_2750 = local_2930;
      uVar62 = local_1100;
      local_1100._4_4_ = uVar64;
      uVar63 = uStack_10f8;
      uStack_10f8._4_4_ = uVar65;
      uVar8 = uStack_10f0;
      uStack_10f0._4_4_ = uVar66;
      uVar9 = uStack_10e8;
      uStack_10e8._4_4_ = uVar67;
      uVar10 = local_10e0;
      local_10e0._4_4_ = uVar68;
      uVar11 = uStack_10d8;
      uStack_10d8._4_4_ = uVar69;
      uVar12 = uStack_10d0;
      uStack_10d0._4_4_ = uVar70;
      uVar13 = uStack_10c8;
      uStack_10c8._4_4_ = uVar71;
      uVar14 = local_5c0;
      local_5c0._4_4_ = uVar72;
      uVar15 = uStack_5b8;
      uStack_5b8._4_4_ = uVar73;
      uVar16 = local_5b0;
      local_5b0._4_4_ = uVar74;
      uVar17 = uStack_5a8;
      uStack_5a8._4_4_ = uVar75;
      fVar83 = cosf(*(float *)*local_2930);
      uVar75 = uStack_5a8._4_4_;
      uVar74 = local_5b0._4_4_;
      uVar73 = uStack_5b8._4_4_;
      uVar72 = local_5c0._4_4_;
      uVar71 = uStack_10c8._4_4_;
      uVar70 = uStack_10d0._4_4_;
      uVar69 = uStack_10d8._4_4_;
      uVar68 = local_10e0._4_4_;
      uVar67 = uStack_10e8._4_4_;
      uVar66 = uStack_10f0._4_4_;
      uVar65 = uStack_10f8._4_4_;
      uVar64 = local_1100._4_4_;
      *(float *)*local_2930 = fVar83;
      local_2930 = (undefined1 (*) [64])(*local_2930 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}